

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined8 uVar26;
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  byte bVar49;
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar54;
  RTCFilterFunctionN p_Var55;
  RTCRayN *pRVar56;
  bool bVar57;
  long lVar58;
  ulong uVar59;
  bool bVar60;
  uint uVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  uint uVar65;
  short sVar66;
  undefined2 uVar103;
  float fVar67;
  float fVar104;
  float fVar105;
  vfloat_impl<4> p00;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar132;
  float fVar133;
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar145;
  float fVar146;
  vfloat4 v;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  float fVar155;
  float fVar156;
  vfloat4 v_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  float fVar158;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar176;
  float fVar202;
  float fVar203;
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar207;
  float fVar208;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar209;
  float fVar222;
  float fVar223;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar247;
  float fVar249;
  vfloat4 a;
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar248;
  float fVar250;
  float fVar251;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar252;
  float fVar253;
  float fVar263;
  float fVar265;
  vfloat4 a_2;
  undefined1 auVar254 [16];
  undefined1 auVar257 [16];
  float fVar264;
  float fVar266;
  float fVar267;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar268;
  float fVar279;
  float fVar280;
  vfloat4 a_3;
  float fVar281;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar293;
  float fVar296;
  float fVar299;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar301;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar321;
  float fVar322;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [24];
  undefined1 (*local_390) [16];
  Primitive *local_388;
  ulong local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  float fStack_340;
  float fStack_33c;
  float afStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  ulong uVar53;
  undefined1 auVar99 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 uVar102;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  
  PVar13 = prim[1];
  uVar51 = (ulong)(byte)PVar13;
  lVar54 = uVar51 * 0x25;
  pPVar4 = prim + lVar54 + 6;
  fVar146 = *(float *)(pPVar4 + 0xc);
  fVar147 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar146;
  fVar155 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar146;
  fVar156 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar146;
  fVar134 = *(float *)(ray + k * 4 + 0x40) * fVar146;
  fVar145 = *(float *)(ray + k * 4 + 0x50) * fVar146;
  fVar146 = *(float *)(ray + k * 4 + 0x60) * fVar146;
  uVar14 = *(undefined4 *)(prim + uVar51 * 4 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar239._8_4_ = 0;
  auVar239._0_8_ = uVar53;
  auVar239._12_2_ = uVar103;
  auVar239._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar136._12_4_ = auVar239._12_4_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar53;
  auVar136._10_2_ = uVar103;
  auVar68._10_6_ = auVar136._10_6_;
  auVar68._8_2_ = uVar103;
  auVar68._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar28._4_8_ = auVar68._8_8_;
  auVar28._2_2_ = uVar103;
  auVar28._0_2_ = uVar103;
  fVar302 = (float)((int)sVar66 >> 8);
  fVar309 = (float)(auVar28._0_4_ >> 0x18);
  fVar313 = (float)(auVar68._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 5 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar53;
  auVar109._12_2_ = uVar103;
  auVar109._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar53;
  auVar108._10_2_ = uVar103;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar103;
  auVar107._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar29._4_8_ = auVar107._8_8_;
  auVar29._2_2_ = uVar103;
  auVar29._0_2_ = uVar103;
  fVar157 = (float)((int)sVar66 >> 8);
  fVar169 = (float)(auVar29._0_4_ >> 0x18);
  fVar171 = (float)(auVar107._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 6 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar53;
  auVar112._12_2_ = uVar103;
  auVar112._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar53;
  auVar111._10_2_ = uVar103;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar103;
  auVar110._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar30._4_8_ = auVar110._8_8_;
  auVar30._2_2_ = uVar103;
  auVar30._0_2_ = uVar103;
  fVar204 = (float)((int)sVar66 >> 8);
  fVar207 = (float)(auVar30._0_4_ >> 0x18);
  fVar208 = (float)(auVar110._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0xf + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar53;
  auVar115._12_2_ = uVar103;
  auVar115._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar53;
  auVar114._10_2_ = uVar103;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar103;
  auVar113._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar31._4_8_ = auVar113._8_8_;
  auVar31._2_2_ = uVar103;
  auVar31._0_2_ = uVar103;
  fVar67 = (float)((int)sVar66 >> 8);
  fVar104 = (float)(auVar31._0_4_ >> 0x18);
  fVar105 = (float)(auVar113._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar53;
  auVar179._12_2_ = uVar103;
  auVar179._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar53;
  auVar178._10_2_ = uVar103;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar103;
  auVar177._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar32._4_8_ = auVar177._8_8_;
  auVar32._2_2_ = uVar103;
  auVar32._0_2_ = uVar103;
  fVar209 = (float)((int)sVar66 >> 8);
  fVar222 = (float)(auVar32._0_4_ >> 0x18);
  fVar223 = (float)(auVar177._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar51 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar53;
  auVar182._12_2_ = uVar103;
  auVar182._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar53;
  auVar181._10_2_ = uVar103;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar103;
  auVar180._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar33._4_8_ = auVar180._8_8_;
  auVar33._2_2_ = uVar103;
  auVar33._0_2_ = uVar103;
  fVar234 = (float)((int)sVar66 >> 8);
  fVar247 = (float)(auVar33._0_4_ >> 0x18);
  fVar249 = (float)(auVar180._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0x1a + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar53;
  auVar185._12_2_ = uVar103;
  auVar185._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar53;
  auVar184._10_2_ = uVar103;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar103;
  auVar183._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar34._4_8_ = auVar183._8_8_;
  auVar34._2_2_ = uVar103;
  auVar34._0_2_ = uVar103;
  fVar224 = (float)((int)sVar66 >> 8);
  fVar232 = (float)(auVar34._0_4_ >> 0x18);
  fVar233 = (float)(auVar183._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0x1b + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar53;
  auVar188._12_2_ = uVar103;
  auVar188._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar53;
  auVar187._10_2_ = uVar103;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar103;
  auVar186._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar35._4_8_ = auVar186._8_8_;
  auVar35._2_2_ = uVar103;
  auVar35._0_2_ = uVar103;
  fVar252 = (float)((int)sVar66 >> 8);
  fVar263 = (float)(auVar35._0_4_ >> 0x18);
  fVar265 = (float)(auVar186._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0x1c + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar53;
  auVar191._12_2_ = uVar103;
  auVar191._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar53;
  auVar190._10_2_ = uVar103;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar103;
  auVar189._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar36._4_8_ = auVar189._8_8_;
  auVar36._2_2_ = uVar103;
  auVar36._0_2_ = uVar103;
  fVar106 = (float)((int)sVar66 >> 8);
  fVar132 = (float)(auVar36._0_4_ >> 0x18);
  fVar133 = (float)(auVar189._8_4_ >> 0x18);
  fVar282 = fVar134 * fVar302 + fVar145 * fVar157 + fVar146 * fVar204;
  fVar293 = fVar134 * fVar309 + fVar145 * fVar169 + fVar146 * fVar207;
  fVar296 = fVar134 * fVar313 + fVar145 * fVar171 + fVar146 * fVar208;
  fVar299 = fVar134 * (float)(auVar136._12_4_ >> 0x18) +
            fVar145 * (float)(auVar108._12_4_ >> 0x18) + fVar146 * (float)(auVar111._12_4_ >> 0x18);
  fVar268 = fVar134 * fVar67 + fVar145 * fVar209 + fVar146 * fVar234;
  fVar279 = fVar134 * fVar104 + fVar145 * fVar222 + fVar146 * fVar247;
  fVar280 = fVar134 * fVar105 + fVar145 * fVar223 + fVar146 * fVar249;
  fVar281 = fVar134 * (float)(auVar114._12_4_ >> 0x18) +
            fVar145 * (float)(auVar178._12_4_ >> 0x18) + fVar146 * (float)(auVar181._12_4_ >> 0x18);
  fVar176 = fVar134 * fVar224 + fVar145 * fVar252 + fVar146 * fVar106;
  fVar202 = fVar134 * fVar232 + fVar145 * fVar263 + fVar146 * fVar132;
  fVar203 = fVar134 * fVar233 + fVar145 * fVar265 + fVar146 * fVar133;
  fVar134 = fVar134 * (float)(auVar184._12_4_ >> 0x18) +
            fVar145 * (float)(auVar187._12_4_ >> 0x18) + fVar146 * (float)(auVar190._12_4_ >> 0x18);
  fVar303 = fVar302 * fVar147 + fVar157 * fVar155 + fVar204 * fVar156;
  fVar309 = fVar309 * fVar147 + fVar169 * fVar155 + fVar207 * fVar156;
  fVar313 = fVar313 * fVar147 + fVar171 * fVar155 + fVar208 * fVar156;
  fVar317 = (float)(auVar136._12_4_ >> 0x18) * fVar147 +
            (float)(auVar108._12_4_ >> 0x18) * fVar155 + (float)(auVar111._12_4_ >> 0x18) * fVar156;
  fVar234 = fVar67 * fVar147 + fVar209 * fVar155 + fVar234 * fVar156;
  fVar247 = fVar104 * fVar147 + fVar222 * fVar155 + fVar247 * fVar156;
  fVar249 = fVar105 * fVar147 + fVar223 * fVar155 + fVar249 * fVar156;
  fVar302 = (float)(auVar114._12_4_ >> 0x18) * fVar147 +
            (float)(auVar178._12_4_ >> 0x18) * fVar155 + (float)(auVar181._12_4_ >> 0x18) * fVar156;
  fVar224 = fVar147 * fVar224 + fVar155 * fVar252 + fVar156 * fVar106;
  fVar232 = fVar147 * fVar232 + fVar155 * fVar263 + fVar156 * fVar132;
  fVar233 = fVar147 * fVar233 + fVar155 * fVar265 + fVar156 * fVar133;
  fVar252 = fVar147 * (float)(auVar184._12_4_ >> 0x18) +
            fVar155 * (float)(auVar187._12_4_ >> 0x18) + fVar156 * (float)(auVar190._12_4_ >> 0x18);
  fVar146 = (float)DAT_01f80d30;
  fVar67 = DAT_01f80d30._4_4_;
  fVar104 = DAT_01f80d30._8_4_;
  fVar105 = DAT_01f80d30._12_4_;
  uVar61 = -(uint)(fVar146 <= ABS(fVar282));
  uVar62 = -(uint)(fVar67 <= ABS(fVar293));
  uVar64 = -(uint)(fVar104 <= ABS(fVar296));
  uVar65 = -(uint)(fVar105 <= ABS(fVar299));
  auVar285._0_4_ = (uint)fVar282 & uVar61;
  auVar285._4_4_ = (uint)fVar293 & uVar62;
  auVar285._8_4_ = (uint)fVar296 & uVar64;
  auVar285._12_4_ = (uint)fVar299 & uVar65;
  auVar148._0_4_ = ~uVar61 & (uint)fVar146;
  auVar148._4_4_ = ~uVar62 & (uint)fVar67;
  auVar148._8_4_ = ~uVar64 & (uint)fVar104;
  auVar148._12_4_ = ~uVar65 & (uint)fVar105;
  auVar148 = auVar148 | auVar285;
  uVar61 = -(uint)(fVar146 <= ABS(fVar268));
  uVar62 = -(uint)(fVar67 <= ABS(fVar279));
  uVar64 = -(uint)(fVar104 <= ABS(fVar280));
  uVar65 = -(uint)(fVar105 <= ABS(fVar281));
  auVar269._0_4_ = (uint)fVar268 & uVar61;
  auVar269._4_4_ = (uint)fVar279 & uVar62;
  auVar269._8_4_ = (uint)fVar280 & uVar64;
  auVar269._12_4_ = (uint)fVar281 & uVar65;
  auVar205._0_4_ = ~uVar61 & (uint)fVar146;
  auVar205._4_4_ = ~uVar62 & (uint)fVar67;
  auVar205._8_4_ = ~uVar64 & (uint)fVar104;
  auVar205._12_4_ = ~uVar65 & (uint)fVar105;
  auVar205 = auVar205 | auVar269;
  uVar61 = -(uint)(fVar146 <= ABS(fVar176));
  uVar62 = -(uint)(fVar67 <= ABS(fVar202));
  uVar64 = -(uint)(fVar104 <= ABS(fVar203));
  uVar65 = -(uint)(fVar105 <= ABS(fVar134));
  auVar192._0_4_ = (uint)fVar176 & uVar61;
  auVar192._4_4_ = (uint)fVar202 & uVar62;
  auVar192._8_4_ = (uint)fVar203 & uVar64;
  auVar192._12_4_ = (uint)fVar134 & uVar65;
  auVar210._0_4_ = ~uVar61 & (uint)fVar146;
  auVar210._4_4_ = ~uVar62 & (uint)fVar67;
  auVar210._8_4_ = ~uVar64 & (uint)fVar104;
  auVar210._12_4_ = ~uVar65 & (uint)fVar105;
  auVar210 = auVar210 | auVar192;
  auVar68 = rcpps(_DAT_01f80d30,auVar148);
  fVar146 = auVar68._0_4_;
  fVar105 = auVar68._4_4_;
  fVar157 = auVar68._8_4_;
  fVar209 = auVar68._12_4_;
  fVar146 = (1.0 - auVar148._0_4_ * fVar146) * fVar146 + fVar146;
  fVar105 = (1.0 - auVar148._4_4_ * fVar105) * fVar105 + fVar105;
  fVar157 = (1.0 - auVar148._8_4_ * fVar157) * fVar157 + fVar157;
  fVar209 = (1.0 - auVar148._12_4_ * fVar209) * fVar209 + fVar209;
  auVar68 = rcpps(auVar68,auVar205);
  fVar67 = auVar68._0_4_;
  fVar106 = auVar68._4_4_;
  fVar169 = auVar68._8_4_;
  fVar222 = auVar68._12_4_;
  fVar67 = (1.0 - auVar205._0_4_ * fVar67) * fVar67 + fVar67;
  fVar106 = (1.0 - auVar205._4_4_ * fVar106) * fVar106 + fVar106;
  fVar169 = (1.0 - auVar205._8_4_ * fVar169) * fVar169 + fVar169;
  fVar222 = (1.0 - auVar205._12_4_ * fVar222) * fVar222 + fVar222;
  auVar68 = rcpps(auVar68,auVar210);
  fVar104 = auVar68._0_4_;
  fVar132 = auVar68._4_4_;
  fVar171 = auVar68._8_4_;
  fVar223 = auVar68._12_4_;
  fVar104 = (1.0 - auVar210._0_4_ * fVar104) * fVar104 + fVar104;
  fVar132 = (1.0 - auVar210._4_4_ * fVar132) * fVar132 + fVar132;
  fVar171 = (1.0 - auVar210._8_4_ * fVar171) * fVar171 + fVar171;
  fVar223 = (1.0 - auVar210._12_4_ * fVar223) * fVar223 + fVar223;
  fVar263 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar54 + 0x16)) *
            *(float *)(prim + lVar54 + 0x1a);
  uVar53 = *(ulong *)(prim + uVar51 * 7 + 6);
  uVar103 = (undefined2)(uVar53 >> 0x30);
  auVar241._8_4_ = 0;
  auVar241._0_8_ = uVar53;
  auVar241._12_2_ = uVar103;
  auVar241._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar53 >> 0x20);
  auVar69._12_4_ = auVar241._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar53;
  auVar69._10_2_ = uVar103;
  auVar138._10_6_ = auVar69._10_6_;
  auVar138._8_2_ = uVar103;
  auVar138._0_8_ = uVar53;
  uVar103 = (undefined2)(uVar53 >> 0x10);
  auVar37._4_8_ = auVar138._8_8_;
  auVar37._2_2_ = uVar103;
  auVar37._0_2_ = uVar103;
  fVar133 = (float)(auVar37._0_4_ >> 0x10);
  fVar176 = (float)(auVar138._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar51 * 0xb + 6);
  uVar103 = (undefined2)(uVar52 >> 0x30);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar52;
  auVar151._12_2_ = uVar103;
  auVar151._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar52 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar52;
  auVar150._10_2_ = uVar103;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar103;
  auVar149._0_8_ = uVar52;
  uVar103 = (undefined2)(uVar52 >> 0x10);
  auVar38._4_8_ = auVar149._8_8_;
  auVar38._2_2_ = uVar103;
  auVar38._0_2_ = uVar103;
  uVar5 = *(ulong *)(prim + uVar51 * 9 + 6);
  uVar103 = (undefined2)(uVar5 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar5;
  auVar72._12_2_ = uVar103;
  auVar72._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar5 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar5;
  auVar71._10_2_ = uVar103;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar103;
  auVar70._0_8_ = uVar5;
  uVar103 = (undefined2)(uVar5 >> 0x10);
  auVar39._4_8_ = auVar70._8_8_;
  auVar39._2_2_ = uVar103;
  auVar39._0_2_ = uVar103;
  fVar134 = (float)(auVar39._0_4_ >> 0x10);
  fVar202 = (float)(auVar70._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar51 * 0xd + 6);
  uVar103 = (undefined2)(uVar6 >> 0x30);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar6;
  auVar213._12_2_ = uVar103;
  auVar213._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar6 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar6;
  auVar212._10_2_ = uVar103;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar103;
  auVar211._0_8_ = uVar6;
  uVar103 = (undefined2)(uVar6 >> 0x10);
  auVar40._4_8_ = auVar211._8_8_;
  auVar40._2_2_ = uVar103;
  auVar40._0_2_ = uVar103;
  uVar7 = *(ulong *)(prim + uVar51 * 0x12 + 6);
  uVar103 = (undefined2)(uVar7 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar7;
  auVar75._12_2_ = uVar103;
  auVar75._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar7 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar7;
  auVar74._10_2_ = uVar103;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar103;
  auVar73._0_8_ = uVar7;
  uVar103 = (undefined2)(uVar7 >> 0x10);
  auVar41._4_8_ = auVar73._8_8_;
  auVar41._2_2_ = uVar103;
  auVar41._0_2_ = uVar103;
  fVar145 = (float)(auVar41._0_4_ >> 0x10);
  fVar203 = (float)(auVar73._8_4_ >> 0x10);
  uVar59 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar51 * 2 + uVar59 + 6);
  uVar103 = (undefined2)(uVar8 >> 0x30);
  auVar237._8_4_ = 0;
  auVar237._0_8_ = uVar8;
  auVar237._12_2_ = uVar103;
  auVar237._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar8 >> 0x20);
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._8_2_ = 0;
  auVar236._0_8_ = uVar8;
  auVar236._10_2_ = uVar103;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._8_2_ = uVar103;
  auVar235._0_8_ = uVar8;
  uVar103 = (undefined2)(uVar8 >> 0x10);
  auVar42._4_8_ = auVar235._8_8_;
  auVar42._2_2_ = uVar103;
  auVar42._0_2_ = uVar103;
  uVar59 = *(ulong *)(prim + uVar59 + 6);
  uVar103 = (undefined2)(uVar59 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar59;
  auVar78._12_2_ = uVar103;
  auVar78._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar59 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar59;
  auVar77._10_2_ = uVar103;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar103;
  auVar76._0_8_ = uVar59;
  uVar103 = (undefined2)(uVar59 >> 0x10);
  auVar43._4_8_ = auVar76._8_8_;
  auVar43._2_2_ = uVar103;
  auVar43._0_2_ = uVar103;
  fVar147 = (float)(auVar43._0_4_ >> 0x10);
  fVar204 = (float)(auVar76._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar51 * 0x18 + 6);
  uVar103 = (undefined2)(uVar9 >> 0x30);
  auVar256._8_4_ = 0;
  auVar256._0_8_ = uVar9;
  auVar256._12_2_ = uVar103;
  auVar256._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar9 >> 0x20);
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar9;
  auVar255._10_2_ = uVar103;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._8_2_ = uVar103;
  auVar254._0_8_ = uVar9;
  uVar103 = (undefined2)(uVar9 >> 0x10);
  auVar44._4_8_ = auVar254._8_8_;
  auVar44._2_2_ = uVar103;
  auVar44._0_2_ = uVar103;
  uVar10 = *(ulong *)(prim + uVar51 * 0x1d + 6);
  uVar103 = (undefined2)(uVar10 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar10;
  auVar81._12_2_ = uVar103;
  auVar81._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar10 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._10_2_ = uVar103;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar103;
  auVar79._0_8_ = uVar10;
  uVar103 = (undefined2)(uVar10 >> 0x10);
  auVar45._4_8_ = auVar79._8_8_;
  auVar45._2_2_ = uVar103;
  auVar45._0_2_ = uVar103;
  fVar155 = (float)(auVar45._0_4_ >> 0x10);
  fVar207 = (float)(auVar79._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar51 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar103 = (undefined2)(uVar11 >> 0x30);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar11;
  auVar272._12_2_ = uVar103;
  auVar272._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar11 >> 0x20);
  auVar271._12_4_ = auVar272._12_4_;
  auVar271._8_2_ = 0;
  auVar271._0_8_ = uVar11;
  auVar271._10_2_ = uVar103;
  auVar270._10_6_ = auVar271._10_6_;
  auVar270._8_2_ = uVar103;
  auVar270._0_8_ = uVar11;
  uVar103 = (undefined2)(uVar11 >> 0x10);
  auVar46._4_8_ = auVar270._8_8_;
  auVar46._2_2_ = uVar103;
  auVar46._0_2_ = uVar103;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar51) + 6);
  uVar103 = (undefined2)(uVar12 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar12;
  auVar84._12_2_ = uVar103;
  auVar84._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar12 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar12;
  auVar83._10_2_ = uVar103;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar103;
  auVar82._0_8_ = uVar12;
  uVar103 = (undefined2)(uVar12 >> 0x10);
  auVar47._4_8_ = auVar82._8_8_;
  auVar47._2_2_ = uVar103;
  auVar47._0_2_ = uVar103;
  fVar156 = (float)(auVar47._0_4_ >> 0x10);
  fVar208 = (float)(auVar82._8_4_ >> 0x10);
  uVar51 = *(ulong *)(prim + uVar51 * 0x23 + 6);
  uVar103 = (undefined2)(uVar51 >> 0x30);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar51;
  auVar288._12_2_ = uVar103;
  auVar288._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar51 >> 0x20);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._8_2_ = 0;
  auVar287._0_8_ = uVar51;
  auVar287._10_2_ = uVar103;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = uVar103;
  auVar286._0_8_ = uVar51;
  uVar103 = (undefined2)(uVar51 >> 0x10);
  auVar48._4_8_ = auVar286._8_8_;
  auVar48._2_2_ = uVar103;
  auVar48._0_2_ = uVar103;
  auVar152._0_8_ =
       CONCAT44(((((float)(auVar38._0_4_ >> 0x10) - fVar133) * fVar263 + fVar133) - fVar309) *
                fVar105,((((float)(int)(short)uVar52 - (float)(int)(short)uVar53) * fVar263 +
                         (float)(int)(short)uVar53) - fVar303) * fVar146);
  auVar152._8_4_ =
       ((((float)(auVar149._8_4_ >> 0x10) - fVar176) * fVar263 + fVar176) - fVar313) * fVar157;
  auVar152._12_4_ =
       ((((float)(auVar150._12_4_ >> 0x10) - (float)(auVar69._12_4_ >> 0x10)) * fVar263 +
        (float)(auVar69._12_4_ >> 0x10)) - fVar317) * fVar209;
  auVar214._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar5) * fVar263 + (float)(int)(short)uVar5)
       - fVar303) * fVar146;
  auVar214._4_4_ =
       ((((float)(auVar40._0_4_ >> 0x10) - fVar134) * fVar263 + fVar134) - fVar309) * fVar105;
  auVar214._8_4_ =
       ((((float)(auVar211._8_4_ >> 0x10) - fVar202) * fVar263 + fVar202) - fVar313) * fVar157;
  auVar214._12_4_ =
       ((((float)(auVar212._12_4_ >> 0x10) - (float)(auVar71._12_4_ >> 0x10)) * fVar263 +
        (float)(auVar71._12_4_ >> 0x10)) - fVar317) * fVar209;
  auVar238._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar145) * fVar263 + fVar145) - fVar247) *
                fVar106,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar263 +
                         (float)(int)(short)uVar7) - fVar234) * fVar67);
  auVar238._8_4_ =
       ((((float)(auVar235._8_4_ >> 0x10) - fVar203) * fVar263 + fVar203) - fVar249) * fVar169;
  auVar238._12_4_ =
       ((((float)(auVar236._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar263 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar302) * fVar222;
  auVar257._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar59) * fVar263 +
        (float)(int)(short)uVar59) - fVar234) * fVar67;
  auVar257._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar147) * fVar263 + fVar147) - fVar247) * fVar106;
  auVar257._8_4_ =
       ((((float)(auVar254._8_4_ >> 0x10) - fVar204) * fVar263 + fVar204) - fVar249) * fVar169;
  auVar257._12_4_ =
       ((((float)(auVar255._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar263 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar302) * fVar222;
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar273._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar155) * fVar263 + fVar155) - fVar232) *
                fVar132,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar263 +
                         (float)(int)(short)uVar10) - fVar224) * fVar104);
  auVar273._8_4_ =
       ((((float)(auVar270._8_4_ >> 0x10) - fVar207) * fVar263 + fVar207) - fVar233) * fVar171;
  auVar273._12_4_ =
       ((((float)(auVar271._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar263 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar252) * fVar223;
  auVar289._0_4_ =
       ((((float)(int)(short)uVar51 - (float)(int)(short)uVar12) * fVar263 +
        (float)(int)(short)uVar12) - fVar224) * fVar104;
  auVar289._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar156) * fVar263 + fVar156) - fVar232) * fVar132;
  auVar289._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - fVar208) * fVar263 + fVar208) - fVar233) * fVar171;
  auVar289._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar263 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar252) * fVar223;
  auVar135._8_4_ = auVar152._8_4_;
  auVar135._0_8_ = auVar152._0_8_;
  auVar135._12_4_ = auVar152._12_4_;
  auVar136 = minps(auVar135,auVar214);
  auVar116._8_4_ = auVar238._8_4_;
  auVar116._0_8_ = auVar238._0_8_;
  auVar116._12_4_ = auVar238._12_4_;
  auVar68 = minps(auVar116,auVar257);
  auVar136 = maxps(auVar136,auVar68);
  auVar117._8_4_ = auVar273._8_4_;
  auVar117._0_8_ = auVar273._0_8_;
  auVar117._12_4_ = auVar273._12_4_;
  auVar68 = minps(auVar117,auVar289);
  auVar85._4_4_ = uVar14;
  auVar85._0_4_ = uVar14;
  auVar85._8_4_ = uVar14;
  auVar85._12_4_ = uVar14;
  auVar68 = maxps(auVar68,auVar85);
  auVar68 = maxps(auVar136,auVar68);
  auVar136 = maxps(auVar152,auVar214);
  auVar239 = maxps(auVar238,auVar257);
  auVar136 = minps(auVar136,auVar239);
  local_298 = auVar68._0_4_ * 0.99999964;
  fStack_294 = auVar68._4_4_ * 0.99999964;
  fStack_290 = auVar68._8_4_ * 0.99999964;
  fStack_28c = auVar68._12_4_ * 0.99999964;
  auVar68 = maxps(auVar273,auVar289);
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar86._4_4_ = uVar14;
  auVar86._0_4_ = uVar14;
  auVar86._8_4_ = uVar14;
  auVar86._12_4_ = uVar14;
  auVar68 = minps(auVar68,auVar86);
  auVar68 = minps(auVar136,auVar68);
  uVar61 = (uint)(byte)PVar13;
  auVar118._0_4_ = -(uint)(uVar61 != 0 && local_298 <= auVar68._0_4_ * 1.0000004);
  auVar118._4_4_ = -(uint)(1 < uVar61 && fStack_294 <= auVar68._4_4_ * 1.0000004);
  auVar118._8_4_ = -(uint)(2 < uVar61 && fStack_290 <= auVar68._8_4_ * 1.0000004);
  auVar118._12_4_ = -(uint)(3 < uVar61 && fStack_28c <= auVar68._12_4_ * 1.0000004);
  uVar61 = movmskps(uVar61,auVar118);
  if (uVar61 == 0) {
    return false;
  }
  uVar61 = uVar61 & 0xff;
  local_390 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_278._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_278._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_278._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_278._12_4_ = 0;
  local_388 = prim;
LAB_00b568bd:
  uVar53 = (ulong)uVar61;
  lVar54 = 0;
  if (uVar53 != 0) {
    for (; (uVar61 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
    }
  }
  uVar62 = *(uint *)(local_388 + 2);
  uVar64 = *(uint *)(local_388 + lVar54 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar62].ptr;
  fVar146 = pGVar15->fnumTimeSegments;
  fVar67 = (pGVar15->time_range).lower;
  fVar104 = ((*(float *)(ray + k * 4 + 0x70) - fVar67) / ((pGVar15->time_range).upper - fVar67)) *
            fVar146;
  fVar67 = floorf(fVar104);
  fVar146 = fVar146 + -1.0;
  if (fVar146 <= fVar67) {
    fVar67 = fVar146;
  }
  fVar146 = 0.0;
  if (0.0 <= fVar67) {
    fVar146 = fVar67;
  }
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar64 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar58 = (long)(int)fVar146 * 0x38;
  lVar17 = *(long *)(_Var16 + lVar58);
  lVar18 = *(long *)(_Var16 + 0x10 + lVar58);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar52);
  fVar67 = *pfVar3;
  fVar105 = pfVar3[1];
  fVar106 = pfVar3[2];
  fVar132 = pfVar3[3];
  lVar54 = uVar52 + 1;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar54);
  fVar133 = *pfVar3;
  fVar134 = pfVar3[1];
  fVar145 = pfVar3[2];
  fVar147 = pfVar3[3];
  lVar1 = uVar52 + 2;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar155 = *pfVar3;
  fVar156 = pfVar3[1];
  fVar157 = pfVar3[2];
  fVar169 = pfVar3[3];
  lVar2 = uVar52 + 3;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar171 = *pfVar3;
  fVar176 = pfVar3[1];
  fVar202 = pfVar3[2];
  fVar203 = pfVar3[3];
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar17 + lVar58);
  lVar19 = *(long *)(lVar17 + 0x10 + lVar58);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar52);
  fVar204 = *pfVar3;
  fVar207 = pfVar3[1];
  fVar208 = pfVar3[2];
  fVar209 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar54);
  fVar222 = *pfVar3;
  fVar223 = pfVar3[1];
  fVar234 = pfVar3[2];
  fVar247 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar249 = *pfVar3;
  fVar302 = pfVar3[1];
  fVar224 = pfVar3[2];
  fVar232 = pfVar3[3];
  fVar104 = fVar104 - fVar146;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar146 = *pfVar3;
  fVar233 = pfVar3[1];
  fVar252 = pfVar3[2];
  fVar263 = pfVar3[3];
  fVar304 = (fVar155 * 0.5 + fVar171 * 0.0 + fVar133 * 0.0) - fVar67 * 0.5;
  fVar310 = (fVar156 * 0.5 + fVar176 * 0.0 + fVar134 * 0.0) - fVar105 * 0.5;
  fVar314 = (fVar157 * 0.5 + fVar202 * 0.0 + fVar145 * 0.0) - fVar106 * 0.5;
  fVar318 = (fVar169 * 0.5 + fVar203 * 0.0 + fVar147 * 0.0) - fVar132 * 0.5;
  fVar317 = (fVar249 * 0.5 + fVar146 * 0.0 + fVar222 * 0.0) - fVar204 * 0.5;
  fVar248 = (fVar302 * 0.5 + fVar233 * 0.0 + fVar223 * 0.0) - fVar207 * 0.5;
  fVar250 = (fVar224 * 0.5 + fVar252 * 0.0 + fVar234 * 0.0) - fVar208 * 0.5;
  fVar251 = (fVar232 * 0.5 + fVar263 * 0.0 + fVar247 * 0.0) - fVar209 * 0.5;
  fVar265 = fVar155 * 0.0 + fVar171 * -0.0 + fVar133 + fVar67 * -0.0;
  fVar268 = fVar156 * 0.0 + fVar176 * -0.0 + fVar134 + fVar105 * -0.0;
  fVar279 = fVar157 * 0.0 + fVar202 * -0.0 + fVar145 + fVar106 * -0.0;
  fVar280 = fVar169 * 0.0 + fVar203 * -0.0 + fVar147 + fVar132 * -0.0;
  fVar305 = fVar249 * 0.0 + fVar146 * -0.0 + fVar222 + fVar204 * -0.0;
  fVar311 = fVar302 * 0.0 + fVar233 * -0.0 + fVar223 + fVar207 * -0.0;
  fVar315 = fVar224 * 0.0 + fVar252 * -0.0 + fVar234 + fVar208 * -0.0;
  fVar319 = fVar232 * 0.0 + fVar263 * -0.0 + fVar247 + fVar209 * -0.0;
  fVar282 = fVar171 * -0.0 + fVar155 + fVar133 * 0.0 + fVar67 * -0.0;
  fVar296 = fVar176 * -0.0 + fVar156 + fVar134 * 0.0 + fVar105 * -0.0;
  fVar303 = fVar202 * -0.0 + fVar157 + fVar145 * 0.0 + fVar106 * -0.0;
  fVar313 = fVar203 * -0.0 + fVar169 + fVar147 * 0.0 + fVar132 * -0.0;
  fVar281 = fVar67 * 0.0 + ((fVar171 * 0.5 + fVar155 * 0.0) - fVar133 * 0.5);
  fVar293 = fVar105 * 0.0 + ((fVar176 * 0.5 + fVar156 * 0.0) - fVar134 * 0.5);
  fVar299 = fVar106 * 0.0 + ((fVar202 * 0.5 + fVar157 * 0.0) - fVar145 * 0.5);
  fVar309 = fVar132 * 0.0 + ((fVar203 * 0.5 + fVar169 * 0.0) - fVar147 * 0.5);
  fVar106 = fVar146 * -0.0 + fVar249 + fVar222 * 0.0 + fVar204 * -0.0;
  fVar132 = fVar233 * -0.0 + fVar302 + fVar223 * 0.0 + fVar207 * -0.0;
  fVar133 = fVar252 * -0.0 + fVar224 + fVar234 * 0.0 + fVar208 * -0.0;
  fVar134 = fVar263 * -0.0 + fVar232 + fVar247 * 0.0 + fVar209 * -0.0;
  fVar146 = fVar204 * 0.0 + ((fVar146 * 0.5 + fVar249 * 0.0) - fVar222 * 0.5);
  fVar67 = fVar207 * 0.0 + ((fVar233 * 0.5 + fVar302 * 0.0) - fVar223 * 0.5);
  fVar105 = fVar208 * 0.0 + ((fVar252 * 0.5 + fVar224 * 0.0) - fVar234 * 0.5);
  fVar204 = fVar209 * 0.0 + ((fVar263 * 0.5 + fVar232 * 0.0) - fVar247 * 0.5);
  fVar283 = fVar310 * fVar305 - fVar311 * fVar304;
  fVar294 = fVar314 * fVar311 - fVar315 * fVar310;
  fVar297 = fVar304 * fVar315 - fVar305 * fVar314;
  fVar300 = fVar318 * fVar319 - fVar319 * fVar318;
  fVar223 = fVar310 * fVar317 - fVar248 * fVar304;
  fVar247 = fVar314 * fVar248 - fVar250 * fVar310;
  fVar249 = fVar304 * fVar250 - fVar317 * fVar314;
  fVar233 = fVar293 * fVar106 - fVar132 * fVar281;
  fVar252 = fVar299 * fVar132 - fVar133 * fVar293;
  fVar263 = fVar281 * fVar133 - fVar106 * fVar299;
  fVar315 = fVar309 * fVar134 - fVar134 * fVar309;
  fVar208 = fVar293 * fVar146 - fVar67 * fVar281;
  fVar209 = fVar299 * fVar67 - fVar105 * fVar293;
  fVar222 = fVar281 * fVar105 - fVar146 * fVar299;
  fVar203 = fVar297 * fVar297 + fVar294 * fVar294 + fVar283 * fVar283;
  auVar136 = ZEXT416((uint)fVar203);
  auVar68 = rsqrtss(ZEXT416((uint)fVar203),auVar136);
  fVar146 = auVar68._0_4_;
  fVar248 = fVar146 * 1.5 - fVar146 * fVar146 * fVar203 * 0.5 * fVar146;
  fVar224 = fVar283 * fVar223 + fVar297 * fVar249 + fVar294 * fVar247;
  fVar302 = fVar300 * fVar248;
  auVar68 = rcpss(auVar136,auVar136);
  fVar232 = (2.0 - fVar203 * auVar68._0_4_) * auVar68._0_4_;
  fVar234 = fVar263 * fVar263 + fVar252 * fVar252 + fVar233 * fVar233;
  auVar136 = ZEXT416((uint)fVar234);
  auVar68 = rsqrtss(ZEXT416((uint)fVar234),auVar136);
  fVar146 = auVar68._0_4_;
  fVar319 = fVar146 * 1.5 - fVar146 * fVar146 * fVar234 * 0.5 * fVar146;
  fVar321 = fVar233 * fVar208 + fVar263 * fVar222 + fVar252 * fVar209;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar58);
  lVar19 = *(long *)(_Var16 + 0x48 + lVar58);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar52);
  fVar146 = *pfVar3;
  fVar67 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar54);
  fVar132 = *pfVar3;
  fVar133 = pfVar3[1];
  fVar134 = pfVar3[2];
  fVar145 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar147 = *pfVar3;
  fVar155 = pfVar3[1];
  fVar156 = pfVar3[2];
  fVar157 = pfVar3[3];
  auVar68 = rcpss(auVar136,auVar136);
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar169 = *pfVar3;
  fVar171 = pfVar3[1];
  fVar176 = pfVar3[2];
  fVar202 = pfVar3[3];
  fVar207 = fVar315 * fVar319;
  fVar322 = (2.0 - fVar234 * auVar68._0_4_) * auVar68._0_4_;
  fVar306 = fVar280 * fVar294 * fVar248;
  fVar312 = fVar280 * fVar297 * fVar248;
  fVar316 = fVar280 * fVar283 * fVar248;
  fVar320 = fVar280 * fVar302;
  fVar317 = fVar265 - fVar306;
  fVar250 = fVar268 - fVar312;
  fVar305 = fVar279 - fVar316;
  fVar311 = fVar280 - fVar320;
  fVar284 = fVar280 * fVar232 * (fVar203 * fVar247 - fVar224 * fVar294) * fVar248 +
            fVar318 * fVar294 * fVar248;
  fVar295 = fVar280 * fVar232 * (fVar203 * fVar249 - fVar224 * fVar297) * fVar248 +
            fVar318 * fVar297 * fVar248;
  fVar298 = fVar280 * fVar232 * (fVar203 * fVar223 - fVar224 * fVar283) * fVar248 +
            fVar318 * fVar283 * fVar248;
  fVar301 = fVar280 * fVar232 * (fVar203 * (fVar318 * fVar251 - fVar251 * fVar318) -
                                fVar224 * fVar300) * fVar248 + fVar318 * fVar302;
  fVar306 = fVar306 + fVar265;
  fVar312 = fVar312 + fVar268;
  fVar316 = fVar316 + fVar279;
  fVar320 = fVar320 + fVar280;
  fVar265 = fVar313 * fVar252 * fVar319;
  fVar268 = fVar313 * fVar263 * fVar319;
  fVar279 = fVar313 * fVar233 * fVar319;
  fVar280 = fVar313 * fVar207;
  fVar248 = fVar282 - fVar265;
  fVar251 = fVar296 - fVar268;
  fVar283 = fVar303 - fVar279;
  fVar294 = fVar313 - fVar280;
  fVar158 = fVar313 * fVar322 * (fVar234 * fVar209 - fVar321 * fVar252) * fVar319 +
            fVar309 * fVar252 * fVar319;
  fVar170 = fVar313 * fVar322 * (fVar234 * fVar222 - fVar321 * fVar263) * fVar319 +
            fVar309 * fVar263 * fVar319;
  fVar172 = fVar313 * fVar322 * (fVar234 * fVar208 - fVar321 * fVar233) * fVar319 +
            fVar309 * fVar233 * fVar319;
  fVar174 = fVar313 * fVar322 * (fVar234 * (fVar309 * fVar204 - fVar204 * fVar309) -
                                fVar321 * fVar315) * fVar319 + fVar309 * fVar207;
  fVar265 = fVar265 + fVar282;
  fVar268 = fVar268 + fVar296;
  fVar279 = fVar279 + fVar303;
  fVar280 = fVar280 + fVar313;
  fVar321 = (fVar147 * 0.5 + fVar169 * 0.0 + fVar132 * 0.0) - fVar146 * 0.5;
  fVar322 = (fVar155 * 0.5 + fVar171 * 0.0 + fVar133 * 0.0) - fVar67 * 0.5;
  fVar173 = (fVar156 * 0.5 + fVar176 * 0.0 + fVar134 * 0.0) - fVar105 * 0.5;
  fVar175 = (fVar157 * 0.5 + fVar202 * 0.0 + fVar145 * 0.0) - fVar106 * 0.5;
  lVar18 = *(long *)(lVar17 + 0x38 + lVar58);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar58);
  pfVar3 = (float *)(lVar18 + lVar17 * lVar2);
  fVar203 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar207 = pfVar3[2];
  fVar208 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar1 * lVar17);
  fVar209 = *pfVar3;
  fVar222 = pfVar3[1];
  fVar223 = pfVar3[2];
  fVar234 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar54 * lVar17);
  fVar247 = *pfVar3;
  fVar249 = pfVar3[1];
  fVar302 = pfVar3[2];
  fVar224 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + uVar52 * lVar17);
  fVar232 = *pfVar3;
  fVar233 = pfVar3[1];
  fVar252 = pfVar3[2];
  fVar263 = pfVar3[3];
  fVar253 = (fVar209 * 0.5 + fVar203 * 0.0 + fVar247 * 0.0) - fVar232 * 0.5;
  fVar264 = (fVar222 * 0.5 + fVar204 * 0.0 + fVar249 * 0.0) - fVar233 * 0.5;
  fVar266 = (fVar223 * 0.5 + fVar207 * 0.0 + fVar302 * 0.0) - fVar252 * 0.5;
  fVar267 = (fVar234 * 0.5 + fVar208 * 0.0 + fVar224 * 0.0) - fVar263 * 0.5;
  fVar315 = fVar147 * 0.0 + fVar169 * -0.0 + fVar132 + fVar146 * -0.0;
  fVar319 = fVar155 * 0.0 + fVar171 * -0.0 + fVar133 + fVar67 * -0.0;
  fVar297 = fVar156 * 0.0 + fVar176 * -0.0 + fVar134 + fVar105 * -0.0;
  fVar300 = fVar157 * 0.0 + fVar202 * -0.0 + fVar145 + fVar106 * -0.0;
  fVar282 = fVar169 * -0.0 + fVar147 + fVar132 * 0.0 + fVar146 * -0.0;
  fVar296 = fVar171 * -0.0 + fVar155 + fVar133 * 0.0 + fVar67 * -0.0;
  fVar303 = fVar176 * -0.0 + fVar156 + fVar134 * 0.0 + fVar105 * -0.0;
  fVar313 = fVar202 * -0.0 + fVar157 + fVar145 * 0.0 + fVar106 * -0.0;
  fVar146 = fVar146 * 0.0 + ((fVar169 * 0.5 + fVar147 * 0.0) - fVar132 * 0.5);
  fVar67 = fVar67 * 0.0 + ((fVar171 * 0.5 + fVar155 * 0.0) - fVar133 * 0.5);
  fVar105 = fVar105 * 0.0 + ((fVar176 * 0.5 + fVar156 * 0.0) - fVar134 * 0.5);
  fVar106 = fVar106 * 0.0 + ((fVar202 * 0.5 + fVar157 * 0.0) - fVar145 * 0.5);
  fVar132 = fVar209 * 0.0 + fVar203 * -0.0 + fVar247 + fVar232 * -0.0;
  fVar147 = fVar222 * 0.0 + fVar204 * -0.0 + fVar249 + fVar233 * -0.0;
  fVar155 = fVar223 * 0.0 + fVar207 * -0.0 + fVar302 + fVar252 * -0.0;
  fVar156 = fVar234 * 0.0 + fVar208 * -0.0 + fVar224 + fVar263 * -0.0;
  fVar133 = fVar203 * -0.0 + fVar209 + fVar247 * 0.0 + fVar232 * -0.0;
  fVar134 = fVar204 * -0.0 + fVar222 + fVar249 * 0.0 + fVar233 * -0.0;
  fVar145 = fVar207 * -0.0 + fVar223 + fVar302 * 0.0 + fVar252 * -0.0;
  fVar171 = fVar208 * -0.0 + fVar234 + fVar224 * 0.0 + fVar263 * -0.0;
  fVar176 = fVar232 * 0.0 + ((fVar203 * 0.5 + fVar209 * 0.0) - fVar247 * 0.5);
  fVar202 = fVar233 * 0.0 + ((fVar204 * 0.5 + fVar222 * 0.0) - fVar249 * 0.5);
  fVar203 = fVar252 * 0.0 + ((fVar207 * 0.5 + fVar223 * 0.0) - fVar302 * 0.5);
  fVar224 = fVar263 * 0.0 + ((fVar208 * 0.5 + fVar234 * 0.0) - fVar224 * 0.5);
  fVar204 = fVar322 * fVar132 - fVar147 * fVar321;
  fVar208 = fVar173 * fVar147 - fVar155 * fVar322;
  fVar209 = fVar321 * fVar155 - fVar132 * fVar173;
  fVar222 = fVar175 * fVar156 - fVar156 * fVar175;
  fVar132 = fVar322 * fVar253 - fVar264 * fVar321;
  fVar156 = fVar173 * fVar264 - fVar266 * fVar322;
  fVar169 = fVar321 * fVar266 - fVar253 * fVar173;
  fVar147 = fVar67 * fVar133 - fVar134 * fVar146;
  fVar155 = fVar105 * fVar134 - fVar145 * fVar67;
  fVar157 = fVar146 * fVar145 - fVar133 * fVar105;
  fVar171 = fVar106 * fVar171 - fVar171 * fVar106;
  fVar133 = fVar67 * fVar176 - fVar202 * fVar146;
  fVar134 = fVar105 * fVar202 - fVar203 * fVar67;
  fVar145 = fVar146 * fVar203 - fVar176 * fVar105;
  fVar203 = fVar209 * fVar209 + fVar208 * fVar208 + fVar204 * fVar204;
  auVar68 = ZEXT416((uint)fVar203);
  auVar136 = rsqrtss(ZEXT416((uint)fVar203),auVar68);
  fVar176 = auVar136._0_4_;
  fVar207 = fVar176 * 1.5 - fVar176 * fVar176 * fVar203 * 0.5 * fVar176;
  fVar302 = fVar204 * fVar132 + fVar209 * fVar169 + fVar208 * fVar156;
  auVar68 = rcpss(auVar68,auVar68);
  fVar176 = (2.0 - fVar203 * auVar68._0_4_) * auVar68._0_4_;
  fVar202 = fVar222 * fVar207;
  fVar232 = fVar157 * fVar157 + fVar155 * fVar155 + fVar147 * fVar147;
  auVar68 = ZEXT416((uint)fVar232);
  auVar136 = rsqrtss(ZEXT416((uint)fVar232),auVar68);
  fVar223 = auVar136._0_4_;
  fVar252 = fVar223 * 1.5 - fVar223 * fVar223 * fVar232 * 0.5 * fVar223;
  fVar263 = fVar147 * fVar133 + fVar157 * fVar145 + fVar155 * fVar134;
  auVar68 = rcpss(auVar68,auVar68);
  fVar253 = (2.0 - fVar232 * auVar68._0_4_) * auVar68._0_4_;
  fVar233 = fVar171 * fVar252;
  fVar223 = fVar300 * fVar208 * fVar207;
  fVar234 = fVar300 * fVar209 * fVar207;
  fVar247 = fVar300 * fVar204 * fVar207;
  fVar249 = fVar300 * fVar202;
  fVar156 = fVar300 * fVar176 * (fVar203 * fVar156 - fVar302 * fVar208) * fVar207 +
            fVar175 * fVar208 * fVar207;
  fVar169 = fVar300 * fVar176 * (fVar203 * fVar169 - fVar302 * fVar209) * fVar207 +
            fVar175 * fVar209 * fVar207;
  fVar209 = fVar300 * fVar176 * (fVar203 * fVar132 - fVar302 * fVar204) * fVar207 +
            fVar175 * fVar204 * fVar207;
  fVar222 = fVar300 * fVar176 * (fVar203 * (fVar175 * fVar267 - fVar267 * fVar175) -
                                fVar302 * fVar222) * fVar207 + fVar175 * fVar202;
  fVar176 = fVar315 - fVar223;
  fVar202 = fVar319 - fVar234;
  fVar203 = fVar297 - fVar247;
  fVar302 = fVar300 - fVar249;
  fVar223 = fVar223 + fVar315;
  fVar234 = fVar234 + fVar319;
  fVar247 = fVar247 + fVar297;
  fVar249 = fVar249 + fVar300;
  fVar132 = fVar313 * fVar155 * fVar252;
  fVar204 = fVar313 * fVar157 * fVar252;
  fVar207 = fVar313 * fVar147 * fVar252;
  fVar208 = fVar313 * fVar233;
  fVar315 = fVar313 * fVar253 * (fVar232 * fVar134 - fVar263 * fVar155) * fVar252 +
            fVar106 * fVar155 * fVar252;
  fVar319 = fVar313 * fVar253 * (fVar232 * fVar145 - fVar263 * fVar157) * fVar252 +
            fVar106 * fVar157 * fVar252;
  fVar297 = fVar313 * fVar253 * (fVar232 * fVar133 - fVar263 * fVar147) * fVar252 +
            fVar106 * fVar147 * fVar252;
  fVar300 = fVar313 * fVar253 * (fVar232 * (fVar106 * fVar224 - fVar224 * fVar106) -
                                fVar263 * fVar171) * fVar252 + fVar106 * fVar233;
  fVar133 = fVar282 - fVar132;
  fVar134 = fVar296 - fVar204;
  fVar145 = fVar303 - fVar207;
  fVar147 = fVar313 - fVar208;
  fVar132 = fVar132 + fVar282;
  fVar204 = fVar204 + fVar296;
  fVar207 = fVar207 + fVar303;
  fVar208 = fVar208 + fVar313;
  fVar296 = 1.0 - fVar104;
  fVar303 = fVar317 * fVar296 + fVar176 * fVar104;
  fVar313 = fVar250 * fVar296 + fVar202 * fVar104;
  fVar253 = fVar305 * fVar296 + fVar203 * fVar104;
  fVar264 = fVar311 * fVar296 + fVar302 * fVar104;
  fVar317 = ((fVar304 - fVar284) * 0.33333334 + fVar317) * fVar296 +
            ((fVar321 - fVar156) * 0.33333334 + fVar176) * fVar104;
  fVar250 = ((fVar310 - fVar295) * 0.33333334 + fVar250) * fVar296 +
            ((fVar322 - fVar169) * 0.33333334 + fVar202) * fVar104;
  fVar305 = ((fVar314 - fVar298) * 0.33333334 + fVar305) * fVar296 +
            ((fVar173 - fVar209) * 0.33333334 + fVar203) * fVar104;
  fVar311 = ((fVar318 - fVar301) * 0.33333334 + fVar311) * fVar296 +
            ((fVar175 - fVar222) * 0.33333334 + fVar302) * fVar104;
  fVar302 = (fVar248 - (fVar281 - fVar158) * 0.33333334) * fVar296 +
            (fVar133 - (fVar146 - fVar315) * 0.33333334) * fVar104;
  fVar224 = (fVar251 - (fVar293 - fVar170) * 0.33333334) * fVar296 +
            (fVar134 - (fVar67 - fVar319) * 0.33333334) * fVar104;
  fVar232 = (fVar283 - (fVar299 - fVar172) * 0.33333334) * fVar296 +
            (fVar145 - (fVar105 - fVar297) * 0.33333334) * fVar104;
  fVar233 = (fVar294 - (fVar309 - fVar174) * 0.33333334) * fVar296 +
            (fVar147 - (fVar106 - fVar300) * 0.33333334) * fVar104;
  fVar171 = fVar248 * fVar296 + fVar133 * fVar104;
  fVar176 = fVar251 * fVar296 + fVar134 * fVar104;
  fVar202 = fVar283 * fVar296 + fVar145 * fVar104;
  fVar203 = fVar294 * fVar296 + fVar147 * fVar104;
  fVar133 = fVar306 * fVar296 + fVar223 * fVar104;
  fVar145 = fVar312 * fVar296 + fVar234 * fVar104;
  fVar155 = fVar316 * fVar296 + fVar247 * fVar104;
  fVar157 = fVar320 * fVar296 + fVar249 * fVar104;
  fVar252 = ((fVar284 + fVar304) * 0.33333334 + fVar306) * fVar296 +
            ((fVar156 + fVar321) * 0.33333334 + fVar223) * fVar104;
  fVar263 = ((fVar295 + fVar310) * 0.33333334 + fVar312) * fVar296 +
            ((fVar169 + fVar322) * 0.33333334 + fVar234) * fVar104;
  fVar282 = ((fVar298 + fVar314) * 0.33333334 + fVar316) * fVar296 +
            ((fVar209 + fVar173) * 0.33333334 + fVar247) * fVar104;
  fVar249 = ((fVar301 + fVar318) * 0.33333334 + fVar320) * fVar296 +
            ((fVar222 + fVar175) * 0.33333334 + fVar249) * fVar104;
  fVar134 = (fVar265 - (fVar158 + fVar281) * 0.33333334) * fVar296 +
            (fVar132 - (fVar315 + fVar146) * 0.33333334) * fVar104;
  fVar147 = (fVar268 - (fVar170 + fVar293) * 0.33333334) * fVar296 +
            (fVar204 - (fVar319 + fVar67) * 0.33333334) * fVar104;
  fVar156 = (fVar279 - (fVar172 + fVar299) * 0.33333334) * fVar296 +
            (fVar207 - (fVar297 + fVar105) * 0.33333334) * fVar104;
  fVar169 = (fVar280 - (fVar174 + fVar309) * 0.33333334) * fVar296 +
            (fVar208 - (fVar300 + fVar106) * 0.33333334) * fVar104;
  local_288 = fVar296 * fVar265 + fVar104 * fVar132;
  fStack_284 = fVar296 * fVar268 + fVar104 * fVar204;
  fStack_280 = fVar296 * fVar279 + fVar104 * fVar207;
  fStack_27c = fVar296 * fVar280 + fVar104 * fVar208;
  local_1b8 = *(float *)(ray + k * 4);
  fStack_1b4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1b0 = *(float *)(ray + k * 4 + 0x20);
  local_148 = fVar303 - local_1b8;
  fStack_144 = fVar313 - fStack_1b4;
  fStack_140 = fVar253 - fStack_1b0;
  fStack_13c = fVar264 - 0.0;
  fVar146 = pre->ray_space[k].vx.field_0.m128[0];
  fVar67 = pre->ray_space[k].vx.field_0.m128[1];
  fVar104 = pre->ray_space[k].vy.field_0.m128[0];
  fVar105 = pre->ray_space[k].vy.field_0.m128[1];
  fVar106 = pre->ray_space[k].vz.field_0.m128[0];
  fVar132 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = local_148 * fVar146 + fStack_144 * fVar104 + fStack_140 * fVar106;
  fVar209 = local_148 * fVar67 + fStack_144 * fVar105 + fStack_140 * fVar132;
  auVar87._4_4_ = fVar209;
  auVar87._0_4_ = fVar208;
  local_158 = fVar317 - local_1b8;
  fStack_154 = fVar250 - fStack_1b4;
  fStack_150 = fVar305 - fStack_1b0;
  fStack_14c = fVar311 - 0.0;
  fVar265 = local_158 * fVar146 + fStack_154 * fVar104 + fStack_150 * fVar106;
  fVar268 = local_158 * fVar67 + fStack_154 * fVar105 + fStack_150 * fVar132;
  auVar274._4_4_ = fVar268;
  auVar274._0_4_ = fVar265;
  local_168 = fVar302 - local_1b8;
  fStack_164 = fVar224 - fStack_1b4;
  fStack_160 = fVar232 - fStack_1b0;
  fStack_15c = fVar233 - 0.0;
  fVar281 = local_168 * fVar146 + fStack_164 * fVar104 + fStack_160 * fVar106;
  fVar293 = local_168 * fVar67 + fStack_164 * fVar105 + fStack_160 * fVar132;
  local_348 = CONCAT44(fVar293,fVar281);
  local_178 = fVar171 - local_1b8;
  fStack_174 = fVar176 - fStack_1b4;
  fStack_170 = fVar202 - fStack_1b0;
  fStack_16c = fVar203 - 0.0;
  fVar222 = local_178 * fVar146 + fStack_174 * fVar104 + fStack_170 * fVar106;
  fVar223 = local_178 * fVar67 + fStack_174 * fVar105 + fStack_170 * fVar132;
  auVar323._4_4_ = fVar223;
  auVar323._0_4_ = fVar222;
  local_188 = fVar133 - local_1b8;
  fStack_184 = fVar145 - fStack_1b4;
  fStack_180 = fVar155 - fStack_1b0;
  fStack_17c = fVar157 - 0.0;
  fVar234 = local_188 * fVar146 + fStack_184 * fVar104 + fStack_180 * fVar106;
  fVar247 = local_188 * fVar67 + fStack_184 * fVar105 + fStack_180 * fVar132;
  local_198 = fVar252 - local_1b8;
  fStack_194 = fVar263 - fStack_1b4;
  fStack_190 = fVar282 - fStack_1b0;
  fStack_18c = fVar249 - 0.0;
  fVar279 = local_198 * fVar146 + fStack_194 * fVar104 + fStack_190 * fVar106;
  fVar280 = local_198 * fVar67 + fStack_194 * fVar105 + fStack_190 * fVar132;
  auVar274._12_4_ = fVar280;
  auVar274._8_4_ = fVar279;
  local_1a8 = fVar134 - local_1b8;
  fStack_1a4 = fVar147 - fStack_1b4;
  fStack_1a0 = fVar156 - fStack_1b0;
  fStack_19c = fVar169 - 0.0;
  fVar204 = local_1a8 * fVar146 + fStack_1a4 * fVar104 + fStack_1a0 * fVar106;
  fVar207 = local_1a8 * fVar67 + fStack_1a4 * fVar105 + fStack_1a0 * fVar132;
  local_1b8 = local_288 - local_1b8;
  fStack_1b4 = fStack_284 - fStack_1b4;
  fStack_1b0 = fStack_280 - fStack_1b0;
  fStack_1ac = fStack_27c - 0.0;
  fVar104 = local_1b8 * fVar146 + fStack_1b4 * fVar104 + fStack_1b0 * fVar106;
  fVar67 = local_1b8 * fVar67 + fStack_1b4 * fVar105 + fStack_1b0 * fVar132;
  auVar323._12_4_ = fVar67;
  auVar323._8_4_ = fVar104;
  auVar87._8_4_ = fVar234;
  auVar87._12_4_ = fVar247;
  auVar68 = minps(auVar87,auVar274);
  auVar119._8_4_ = fVar204;
  auVar119._0_8_ = local_348;
  auVar119._12_4_ = fVar207;
  auVar136 = minps(auVar119,auVar323);
  auVar68 = minps(auVar68,auVar136);
  auVar120._4_4_ = fVar209;
  auVar120._0_4_ = fVar208;
  auVar120._8_4_ = fVar234;
  auVar120._12_4_ = fVar247;
  auVar136 = maxps(auVar120,auVar274);
  auVar137._4_4_ = fVar293;
  auVar137._0_4_ = fVar281;
  auVar137._8_4_ = fVar204;
  auVar137._12_4_ = fVar207;
  auVar138 = maxps(auVar137,auVar323);
  auVar239 = maxps(auVar136,auVar138);
  auVar20._4_8_ = auVar138._8_8_;
  auVar20._0_4_ = auVar68._4_4_;
  auVar139._0_8_ = auVar20._0_8_ << 0x20;
  auVar139._8_4_ = auVar68._8_4_;
  auVar139._12_4_ = auVar68._12_4_;
  auVar140._8_8_ = auVar68._8_8_;
  auVar140._0_8_ = auVar139._8_8_;
  auVar136 = minps(auVar68,auVar140);
  auVar21._4_8_ = auVar68._8_8_;
  auVar21._0_4_ = auVar239._4_4_;
  auVar141._0_8_ = auVar21._0_8_ << 0x20;
  auVar141._8_4_ = auVar239._8_4_;
  auVar141._12_4_ = auVar239._12_4_;
  auVar142._8_8_ = auVar239._8_8_;
  auVar142._0_8_ = auVar141._8_8_;
  auVar68 = maxps(auVar239,auVar142);
  auVar88._0_8_ = auVar136._0_8_ & 0x7fffffff7fffffff;
  auVar88._8_4_ = auVar136._8_4_ & 0x7fffffff;
  auVar88._12_4_ = auVar136._12_4_ & 0x7fffffff;
  auVar121._0_8_ = auVar68._0_8_ & 0x7fffffff7fffffff;
  auVar121._8_4_ = auVar68._8_4_ & 0x7fffffff;
  auVar121._12_4_ = auVar68._12_4_ & 0x7fffffff;
  auVar68 = maxps(auVar88,auVar121);
  fVar146 = auVar68._4_4_;
  if (auVar68._4_4_ <= auVar68._0_4_) {
    fVar146 = auVar68._0_4_;
  }
  fVar146 = fVar146 * 9.536743e-07;
  local_258 = fVar146;
  fStack_254 = fVar146;
  fStack_250 = fVar146;
  fStack_24c = fVar146;
  local_268 = -fVar146;
  fStack_264 = -fVar146;
  fStack_260 = -fVar146;
  fStack_25c = -fVar146;
  local_3a8._4_4_ = fVar247;
  local_3a8._0_4_ = fVar234;
  local_118 = fVar265 - fVar208;
  fStack_114 = fVar268 - fVar209;
  fStack_110 = fVar279 - fVar234;
  fStack_10c = fVar280 - fVar247;
  local_128 = fVar281 - fVar265;
  fStack_124 = fVar293 - fVar268;
  fStack_120 = fVar204 - fVar279;
  fStack_11c = fVar207 - fVar280;
  afStack_338[0] = fVar204;
  afStack_338[1] = fVar207;
  local_138 = fVar222 - fVar281;
  fStack_134 = fVar223 - fVar293;
  fStack_130 = fVar104 - fVar204;
  fStack_12c = fVar67 - fVar207;
  local_2a8 = fVar133 - fVar303;
  fStack_2a4 = fVar145 - fVar313;
  fStack_2a0 = fVar155 - fVar253;
  fStack_29c = fVar157 - fVar264;
  local_2b8 = fVar252 - fVar317;
  fStack_2b4 = fVar263 - fVar250;
  fStack_2b0 = fVar282 - fVar305;
  fStack_2ac = fVar249 - fVar311;
  local_2c8 = fVar134 - fVar302;
  fStack_2c4 = fVar147 - fVar224;
  fStack_2c0 = fVar156 - fVar232;
  fStack_2bc = fVar169 - fVar233;
  local_2d8 = local_288 - fVar171;
  fStack_2d4 = fStack_284 - fVar176;
  fStack_2d0 = fStack_280 - fVar202;
  fStack_2cc = fStack_27c - fVar203;
  local_2e8 = uVar62;
  uStack_2e4 = uVar62;
  uStack_2e0 = uVar62;
  uStack_2dc = uVar62;
  local_2f8 = uVar64;
  uStack_2f4 = uVar64;
  uStack_2f0 = uVar64;
  uStack_2ec = uVar64;
  bVar57 = false;
  uVar64 = 0;
  fVar105 = *(float *)(ray + k * 4 + 0x30);
  local_538._0_4_ = 0.0;
  fStack_530 = 1.0;
  local_538._4_4_ = 0.0;
  fStack_52c = 1.0;
  local_380 = (ulong)uVar62;
LAB_00b576f7:
  do {
    fVar106 = 1.0 - (float)local_538._4_4_;
    fVar132 = 1.0 - (float)local_538._4_4_;
    fVar157 = 1.0 - fStack_52c;
    fVar169 = 1.0 - fStack_52c;
    fVar300 = fVar208 * fVar106 + fVar234 * (float)local_538._4_4_;
    fVar170 = fVar209 * fVar132 + fVar247 * (float)local_538._4_4_;
    fVar174 = fVar208 * fVar157 + fVar234 * fStack_52c;
    fVar264 = fVar209 * fVar169 + fVar247 * fStack_52c;
    fVar203 = fVar265 * fVar106 + fVar279 * (float)local_538._4_4_;
    fVar311 = fVar268 * fVar132 + fVar280 * (float)local_538._4_4_;
    fVar322 = fVar265 * fVar157 + fVar279 * fStack_52c;
    fVar172 = fVar268 * fVar169 + fVar280 * fStack_52c;
    fVar266 = fVar281 * fVar106 + fVar204 * (float)local_538._4_4_;
    fVar267 = fVar293 * fVar132 + fVar207 * (float)local_538._4_4_;
    fVar318 = fVar281 * fVar157 + fVar204 * fStack_52c;
    fVar320 = fVar293 * fVar169 + fVar207 * fStack_52c;
    fVar294 = fVar106 * fVar222 + (float)local_538._4_4_ * fVar104;
    fVar173 = fVar132 * fVar223 + (float)local_538._4_4_ * fVar67;
    fVar175 = fVar157 * fVar222 + fStack_52c * fVar104;
    fVar284 = fVar169 * fVar223 + fStack_52c * fVar67;
    fVar295 = (fStack_530 - (float)local_538._0_4_) * 0.11111111;
    fVar310 = (fStack_530 - (float)local_538._0_4_) * 0.0 + (float)local_538._0_4_;
    fVar312 = (fStack_530 - (float)local_538._0_4_) * 0.33333334 + (float)local_538._0_4_;
    fVar314 = (fStack_530 - (float)local_538._0_4_) * 0.6666667 + (float)local_538._0_4_;
    fVar316 = (fStack_530 - (float)local_538._0_4_) * 1.0 + (float)local_538._0_4_;
    fVar157 = 1.0 - fVar310;
    fVar249 = 1.0 - fVar312;
    fVar299 = 1.0 - fVar314;
    fVar248 = 1.0 - fVar316;
    fVar233 = fVar203 * fVar157 + fVar266 * fVar310;
    fVar296 = fVar203 * fVar249 + fVar266 * fVar312;
    fVar309 = fVar203 * fVar299 + fVar266 * fVar314;
    fVar251 = fVar203 * fVar248 + fVar266 * fVar316;
    fVar283 = fVar311 * fVar157 + fVar267 * fVar310;
    fVar315 = fVar311 * fVar249 + fVar267 * fVar312;
    fVar319 = fVar311 * fVar299 + fVar267 * fVar314;
    fVar297 = fVar311 * fVar248 + fVar267 * fVar316;
    fVar106 = (fVar300 * fVar157 + fVar203 * fVar310) * fVar157 + fVar310 * fVar233;
    fVar132 = (fVar300 * fVar249 + fVar203 * fVar312) * fVar249 + fVar312 * fVar296;
    fVar169 = (fVar300 * fVar299 + fVar203 * fVar314) * fVar299 + fVar314 * fVar309;
    fVar203 = (fVar300 * fVar248 + fVar203 * fVar316) * fVar248 + fVar316 * fVar251;
    fVar300 = (fVar170 * fVar157 + fVar311 * fVar310) * fVar157 + fVar310 * fVar283;
    fVar158 = (fVar170 * fVar249 + fVar311 * fVar312) * fVar249 + fVar312 * fVar315;
    fVar321 = (fVar170 * fVar299 + fVar311 * fVar314) * fVar299 + fVar314 * fVar319;
    fVar170 = (fVar170 * fVar248 + fVar311 * fVar316) * fVar248 + fVar316 * fVar297;
    fVar233 = fVar233 * fVar157 + (fVar266 * fVar157 + fVar294 * fVar310) * fVar310;
    fVar296 = fVar296 * fVar249 + (fVar266 * fVar249 + fVar294 * fVar312) * fVar312;
    fVar309 = fVar309 * fVar299 + (fVar266 * fVar299 + fVar294 * fVar314) * fVar314;
    fVar311 = fVar251 * fVar248 + (fVar266 * fVar248 + fVar294 * fVar316) * fVar316;
    fVar294 = fVar283 * fVar157 + (fVar267 * fVar157 + fVar173 * fVar310) * fVar310;
    fVar315 = fVar315 * fVar249 + (fVar267 * fVar249 + fVar173 * fVar312) * fVar312;
    fVar319 = fVar319 * fVar299 + (fVar267 * fVar299 + fVar173 * fVar314) * fVar314;
    fVar297 = fVar297 * fVar248 + (fVar267 * fVar248 + fVar173 * fVar316) * fVar316;
    local_378 = fVar157 * fVar106 + fVar310 * fVar233;
    fStack_374 = fVar249 * fVar132 + fVar312 * fVar296;
    fStack_370 = fVar299 * fVar169 + fVar314 * fVar309;
    fStack_36c = fVar248 * fVar203 + fVar316 * fVar311;
    local_248 = fVar157 * fVar300 + fVar310 * fVar294;
    fStack_244 = fVar249 * fVar158 + fVar312 * fVar315;
    fStack_240 = fVar299 * fVar321 + fVar314 * fVar319;
    fStack_23c = fVar248 * fVar170 + fVar316 * fVar297;
    fVar251 = (fVar296 - fVar132) * 3.0 * fVar295;
    fVar283 = (fVar309 - fVar169) * 3.0 * fVar295;
    fVar311 = (fVar311 - fVar203) * 3.0 * fVar295;
    fVar132 = (fVar315 - fVar158) * 3.0 * fVar295;
    fVar203 = (fVar319 - fVar321) * 3.0 * fVar295;
    fVar296 = (fVar297 - fVar170) * 3.0 * fVar295;
    local_1e8._4_4_ = fStack_370;
    local_1e8._0_4_ = fStack_374;
    local_1d8._4_4_ = fStack_240;
    local_1d8._0_4_ = fStack_244;
    local_358 = local_378 + (fVar233 - fVar106) * 3.0 * fVar295;
    fStack_354 = fStack_374 + fVar251;
    fStack_350 = fStack_370 + fVar283;
    fStack_34c = fStack_36c + fVar311;
    fVar106 = local_248 + (fVar294 - fVar300) * 3.0 * fVar295;
    fVar169 = fStack_244 + fVar132;
    fVar233 = fStack_240 + fVar203;
    fVar309 = fStack_23c + fVar296;
    local_1e8._8_4_ = fStack_36c;
    local_1e8._12_4_ = 0;
    local_368._0_4_ = fStack_374 - fVar251;
    local_368._4_4_ = fStack_370 - fVar283;
    local_368._8_4_ = fStack_36c - fVar311;
    local_368._12_4_ = 0;
    fVar132 = fStack_244 - fVar132;
    fVar203 = fStack_240 - fVar203;
    fVar296 = fStack_23c - fVar296;
    fVar251 = fVar322 * fVar157 + fVar318 * fVar310;
    fVar283 = fVar322 * fVar249 + fVar318 * fVar312;
    fVar311 = fVar322 * fVar299 + fVar318 * fVar314;
    fVar294 = fVar322 * fVar248 + fVar318 * fVar316;
    fVar315 = fVar172 * fVar157 + fVar320 * fVar310;
    fVar319 = fVar172 * fVar249 + fVar320 * fVar312;
    fVar297 = fVar172 * fVar299 + fVar320 * fVar314;
    fVar300 = fVar172 * fVar248 + fVar320 * fVar316;
    fVar158 = (fVar174 * fVar157 + fVar322 * fVar310) * fVar157 + fVar310 * fVar251;
    fVar321 = (fVar174 * fVar249 + fVar322 * fVar312) * fVar249 + fVar312 * fVar283;
    fVar170 = (fVar174 * fVar299 + fVar322 * fVar314) * fVar299 + fVar314 * fVar311;
    fVar322 = (fVar174 * fVar248 + fVar322 * fVar316) * fVar248 + fVar316 * fVar294;
    fVar298 = (fVar264 * fVar157 + fVar172 * fVar310) * fVar157 + fVar310 * fVar315;
    fVar301 = (fVar264 * fVar249 + fVar172 * fVar312) * fVar249 + fVar312 * fVar319;
    fVar304 = (fVar264 * fVar299 + fVar172 * fVar314) * fVar299 + fVar314 * fVar297;
    fVar306 = (fVar264 * fVar248 + fVar172 * fVar316) * fVar248 + fVar316 * fVar300;
    fVar172 = fVar251 * fVar157 + (fVar318 * fVar157 + fVar175 * fVar310) * fVar310;
    fVar173 = fVar283 * fVar249 + (fVar318 * fVar249 + fVar175 * fVar312) * fVar312;
    fVar174 = fVar311 * fVar299 + (fVar318 * fVar299 + fVar175 * fVar314) * fVar314;
    fVar175 = fVar294 * fVar248 + (fVar318 * fVar248 + fVar175 * fVar316) * fVar316;
    fVar264 = fVar315 * fVar157 + (fVar320 * fVar157 + fVar284 * fVar310) * fVar310;
    fVar266 = fVar319 * fVar249 + (fVar320 * fVar249 + fVar284 * fVar312) * fVar312;
    fVar267 = fVar297 * fVar299 + (fVar320 * fVar299 + fVar284 * fVar314) * fVar314;
    fVar284 = fVar300 * fVar248 + (fVar320 * fVar248 + fVar284 * fVar316) * fVar316;
    fVar315 = fVar157 * fVar158 + fVar310 * fVar172;
    fVar319 = fVar249 * fVar321 + fVar312 * fVar173;
    fVar297 = fVar299 * fVar170 + fVar314 * fVar174;
    fVar300 = fVar248 * fVar322 + fVar316 * fVar175;
    fVar251 = fVar157 * fVar298 + fVar310 * fVar264;
    fVar283 = fVar249 * fVar301 + fVar312 * fVar266;
    fVar311 = fVar299 * fVar304 + fVar314 * fVar267;
    fVar294 = fVar248 * fVar306 + fVar316 * fVar284;
    fVar157 = (fVar173 - fVar321) * 3.0 * fVar295;
    fVar249 = (fVar174 - fVar170) * 3.0 * fVar295;
    fVar299 = (fVar175 - fVar322) * 3.0 * fVar295;
    fVar248 = (fVar266 - fVar301) * 3.0 * fVar295;
    fVar321 = (fVar267 - fVar304) * 3.0 * fVar295;
    fVar170 = (fVar284 - fVar306) * 3.0 * fVar295;
    local_1f8._4_4_ = fVar297;
    local_1f8._0_4_ = fVar319;
    local_1f8._8_4_ = fVar300;
    local_1f8._12_4_ = 0;
    local_218._4_4_ = fVar311;
    local_218._0_4_ = fVar283;
    local_218._8_4_ = fVar294;
    local_218._12_4_ = 0;
    local_238 = fVar315 + (fVar172 - fVar158) * 3.0 * fVar295;
    fStack_234 = fVar319 + fVar157;
    fStack_230 = fVar297 + fVar249;
    fStack_22c = fVar300 + fVar299;
    local_208 = fVar251 + (fVar264 - fVar298) * 3.0 * fVar295;
    fStack_204 = fVar283 + fVar248;
    fStack_200 = fVar311 + fVar321;
    fStack_1fc = fVar294 + fVar170;
    local_1c8._0_4_ = fVar319 - fVar157;
    local_1c8._4_4_ = fVar297 - fVar249;
    local_1c8._8_4_ = fVar300 - fVar299;
    local_1c8._12_4_ = 0;
    local_228._0_4_ = fVar283 - fVar248;
    local_228._4_4_ = fVar311 - fVar321;
    local_228._8_4_ = fVar294 - fVar170;
    local_228._12_4_ = 0;
    fVar157 = (fVar319 - fStack_374) + (fVar315 - local_378);
    fVar249 = (fVar297 - fStack_370) + (fVar319 - fStack_374);
    fVar299 = (fVar300 - fStack_36c) + (fVar297 - fStack_370);
    fVar248 = (fVar300 - fStack_36c) + 0.0;
    local_1d8._8_4_ = fStack_23c;
    local_1d8._12_4_ = 0;
    fVar158 = (fVar283 - fStack_244) + (fVar251 - local_248);
    fVar321 = (fVar311 - fStack_240) + (fVar283 - fStack_244);
    fVar170 = (fVar294 - fStack_23c) + (fVar311 - fStack_240);
    fVar322 = (fVar294 - fStack_23c) + 0.0;
    auVar215._0_8_ =
         CONCAT44(fStack_244 * fVar249 - fStack_374 * fVar321,
                  local_248 * fVar157 - local_378 * fVar158);
    auVar215._8_4_ = fStack_240 * fVar299 - fStack_370 * fVar170;
    auVar215._12_4_ = fStack_23c * fVar248 - fStack_36c * fVar322;
    auVar159._0_4_ = fVar106 * fVar157 - local_358 * fVar158;
    auVar159._4_4_ = fVar169 * fVar249 - fStack_354 * fVar321;
    auVar159._8_4_ = fVar233 * fVar299 - fStack_350 * fVar170;
    auVar159._12_4_ = fVar309 * fVar248 - fStack_34c * fVar322;
    auVar193._0_8_ =
         CONCAT44(fVar203 * fVar249 - fVar321 * local_368._4_4_,
                  fVar132 * fVar157 - fVar158 * local_368._0_4_);
    auVar193._8_4_ = fVar296 * fVar299 - fVar170 * local_368._8_4_;
    auVar193._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
    auVar290._0_4_ = fVar157 * fStack_244 - fVar158 * fStack_374;
    auVar290._4_4_ = fVar249 * fStack_240 - fVar321 * fStack_370;
    auVar290._8_4_ = fVar299 * fStack_23c - fVar170 * fStack_36c;
    auVar290._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
    auVar240._0_8_ =
         CONCAT44(fVar283 * fVar249 - fVar319 * fVar321,fVar251 * fVar157 - fVar315 * fVar158);
    auVar240._8_4_ = fVar311 * fVar299 - fVar297 * fVar170;
    auVar240._12_4_ = fVar294 * fVar248 - fVar300 * fVar322;
    auVar307._0_4_ = local_208 * fVar157 - local_238 * fVar158;
    auVar307._4_4_ = fStack_204 * fVar249 - fStack_234 * fVar321;
    auVar307._8_4_ = fStack_200 * fVar299 - fStack_230 * fVar170;
    auVar307._12_4_ = fStack_1fc * fVar248 - fStack_22c * fVar322;
    auVar225._0_8_ =
         CONCAT44(local_228._4_4_ * fVar249 - fVar321 * local_1c8._4_4_,
                  local_228._0_4_ * fVar157 - fVar158 * local_1c8._0_4_);
    auVar225._8_4_ = local_228._8_4_ * fVar299 - fVar170 * local_1c8._8_4_;
    auVar225._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
    auVar89._0_4_ = fVar157 * fVar283 - fVar158 * fVar319;
    auVar89._4_4_ = fVar249 * fVar311 - fVar321 * fVar297;
    auVar89._8_4_ = fVar299 * fVar294 - fVar170 * fVar300;
    auVar89._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
    auVar122._8_4_ = auVar215._8_4_;
    auVar122._0_8_ = auVar215._0_8_;
    auVar122._12_4_ = auVar215._12_4_;
    auVar68 = minps(auVar122,auVar159);
    auVar239 = maxps(auVar215,auVar159);
    auVar160._8_4_ = auVar193._8_4_;
    auVar160._0_8_ = auVar193._0_8_;
    auVar160._12_4_ = auVar193._12_4_;
    auVar136 = minps(auVar160,auVar290);
    auVar68 = minps(auVar68,auVar136);
    auVar136 = maxps(auVar193,auVar290);
    auVar138 = maxps(auVar239,auVar136);
    auVar161._8_4_ = auVar240._8_4_;
    auVar161._0_8_ = auVar240._0_8_;
    auVar161._12_4_ = auVar240._12_4_;
    auVar136 = minps(auVar161,auVar307);
    auVar241 = maxps(auVar240,auVar307);
    auVar194._8_4_ = auVar225._8_4_;
    auVar194._0_8_ = auVar225._0_8_;
    auVar194._12_4_ = auVar225._12_4_;
    auVar239 = minps(auVar194,auVar89);
    auVar136 = minps(auVar136,auVar239);
    auVar68 = minps(auVar68,auVar136);
    auVar136 = maxps(auVar225,auVar89);
    auVar136 = maxps(auVar241,auVar136);
    auVar136 = maxps(auVar138,auVar136);
    auVar216._0_4_ =
         -(uint)(local_268 <= auVar136._0_4_ && auVar68._0_4_ <= local_258) & local_278._0_4_;
    auVar216._4_4_ =
         -(uint)(fStack_264 <= auVar136._4_4_ && auVar68._4_4_ <= fStack_254) & local_278._4_4_;
    auVar216._8_4_ =
         -(uint)(fStack_260 <= auVar136._8_4_ && auVar68._8_4_ <= fStack_250) & local_278._8_4_;
    auVar216._12_4_ =
         -(uint)(fStack_25c <= auVar136._12_4_ && auVar68._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar50 = movmskps((int)uVar53,auVar216);
    if (iVar50 != 0) {
      fVar157 = (fVar319 - fVar315) + (fStack_374 - local_378);
      fVar249 = (fVar297 - fVar319) + (fStack_370 - fStack_374);
      fVar299 = (fVar300 - fVar297) + (fStack_36c - fStack_370);
      fVar248 = (0.0 - fVar300) + (0.0 - fStack_36c);
      fVar158 = (fVar283 - fVar251) + (fStack_244 - local_248);
      fVar321 = (fVar311 - fVar283) + (fStack_240 - fStack_244);
      fVar170 = (fVar294 - fVar311) + (fStack_23c - fStack_240);
      fVar322 = (0.0 - fVar294) + (0.0 - fStack_23c);
      auVar324._0_8_ =
           CONCAT44(fStack_244 * fVar249 - fStack_374 * fVar321,
                    local_248 * fVar157 - local_378 * fVar158);
      auVar324._8_4_ = fStack_240 * fVar299 - fStack_370 * fVar170;
      auVar324._12_4_ = fStack_23c * fVar248 - fStack_36c * fVar322;
      auVar162._0_4_ = fVar106 * fVar157 - local_358 * fVar158;
      auVar162._4_4_ = fVar169 * fVar249 - fStack_354 * fVar321;
      auVar162._8_4_ = fVar233 * fVar299 - fStack_350 * fVar170;
      auVar162._12_4_ = fVar309 * fVar248 - fStack_34c * fVar322;
      auVar226._0_8_ =
           CONCAT44(fVar203 * fVar249 - local_368._4_4_ * fVar321,
                    fVar132 * fVar157 - local_368._0_4_ * fVar158);
      auVar226._8_4_ = fVar296 * fVar299 - local_368._8_4_ * fVar170;
      auVar226._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
      auVar195._0_4_ = fStack_244 * fVar157 - fStack_374 * fVar158;
      auVar195._4_4_ = fStack_240 * fVar249 - fStack_370 * fVar321;
      auVar195._8_4_ = fStack_23c * fVar299 - fStack_36c * fVar170;
      auVar195._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
      auVar143._0_8_ =
           CONCAT44(fVar283 * fVar249 - fVar319 * fVar321,fVar251 * fVar157 - fVar315 * fVar158);
      auVar143._8_4_ = fVar311 * fVar299 - fVar297 * fVar170;
      auVar143._12_4_ = fVar294 * fVar248 - fVar300 * fVar322;
      auVar258._0_4_ = local_208 * fVar157 - local_238 * fVar158;
      auVar258._4_4_ = fStack_204 * fVar249 - fStack_234 * fVar321;
      auVar258._8_4_ = fStack_200 * fVar299 - fStack_230 * fVar170;
      auVar258._12_4_ = fStack_1fc * fVar248 - fStack_22c * fVar322;
      auVar291._0_8_ =
           CONCAT44(local_228._4_4_ * fVar249 - local_1c8._4_4_ * fVar321,
                    local_228._0_4_ * fVar157 - local_1c8._0_4_ * fVar158);
      auVar291._8_4_ = local_228._8_4_ * fVar299 - local_1c8._8_4_ * fVar170;
      auVar291._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
      auVar90._0_4_ = fVar157 * fVar283 - fVar158 * fVar319;
      auVar90._4_4_ = fVar249 * fVar311 - fVar321 * fVar297;
      auVar90._8_4_ = fVar299 * fVar294 - fVar170 * fVar300;
      auVar90._12_4_ = fVar248 * 0.0 - fVar322 * 0.0;
      auVar123._8_4_ = auVar324._8_4_;
      auVar123._0_8_ = auVar324._0_8_;
      auVar123._12_4_ = auVar324._12_4_;
      auVar68 = minps(auVar123,auVar162);
      auVar239 = maxps(auVar324,auVar162);
      auVar163._8_4_ = auVar226._8_4_;
      auVar163._0_8_ = auVar226._0_8_;
      auVar163._12_4_ = auVar226._12_4_;
      auVar136 = minps(auVar163,auVar195);
      auVar68 = minps(auVar68,auVar136);
      auVar136 = maxps(auVar226,auVar195);
      auVar241 = maxps(auVar239,auVar136);
      auVar164._8_4_ = auVar143._8_4_;
      auVar164._0_8_ = auVar143._0_8_;
      auVar164._12_4_ = auVar143._12_4_;
      auVar239 = minps(auVar164,auVar258);
      auVar136 = maxps(auVar143,auVar258);
      auVar196._8_4_ = auVar291._8_4_;
      auVar196._0_8_ = auVar291._0_8_;
      auVar196._12_4_ = auVar291._12_4_;
      auVar138 = minps(auVar196,auVar90);
      auVar239 = minps(auVar239,auVar138);
      auVar68 = minps(auVar68,auVar239);
      auVar239 = maxps(auVar291,auVar90);
      auVar136 = maxps(auVar136,auVar239);
      auVar136 = maxps(auVar241,auVar136);
      auVar325._0_4_ =
           -(uint)(local_268 <= auVar136._0_4_ && auVar68._0_4_ <= local_258) & auVar216._0_4_;
      auVar325._4_4_ =
           -(uint)(fStack_264 <= auVar136._4_4_ && auVar68._4_4_ <= fStack_254) & auVar216._4_4_;
      auVar325._8_4_ =
           -(uint)(fStack_260 <= auVar136._8_4_ && auVar68._8_4_ <= fStack_250) & auVar216._8_4_;
      auVar325._12_4_ =
           -(uint)(fStack_25c <= auVar136._12_4_ && auVar68._12_4_ <= fStack_24c) & auVar216._12_4_;
      uVar62 = movmskps(iVar50,auVar325);
      if (uVar62 != 0) {
        uVar53 = (ulong)uVar64;
        afStack_338[uVar53] = (float)(uVar62 & 0xff);
        *(ulong *)(afStack_108 + uVar53 * 2) = CONCAT44(fStack_530,local_538._0_4_);
        *(ulong *)(afStack_58 + uVar53 * 2) = CONCAT44(fStack_52c,local_538._4_4_);
        uVar64 = uVar64 + 1;
      }
    }
LAB_00b57d7f:
    if (uVar64 == 0) {
      if (bVar57 != false) {
        return bVar57;
      }
      fVar146 = *(float *)(ray + k * 4 + 0x80);
      auVar131._4_4_ = -(uint)(fStack_294 <= fVar146);
      auVar131._0_4_ = -(uint)(local_298 <= fVar146);
      auVar131._8_4_ = -(uint)(fStack_290 <= fVar146);
      auVar131._12_4_ = -(uint)(fStack_28c <= fVar146);
      uVar62 = movmskps((int)k,auVar131);
      uVar61 = uVar61 & uVar61 + 0xf & uVar62;
      if (uVar61 == 0) {
        return false;
      }
      goto LAB_00b568bd;
    }
    uVar62 = uVar64 - 1;
    uVar53 = (ulong)uVar62;
    fVar106 = afStack_338[uVar53];
    local_538._4_4_ = afStack_58[uVar53 * 2];
    fStack_52c = afStack_58[uVar53 * 2 + 1];
    uVar52 = 0;
    if (fVar106 != 0.0) {
      for (; ((uint)fVar106 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
      }
    }
    fVar106 = (float)((int)fVar106 - 1U & (uint)fVar106);
    afStack_338[uVar53] = fVar106;
    if (fVar106 == 0.0) {
      uVar64 = uVar62;
    }
    fVar157 = (float)(uVar52 + 1) * 0.33333334;
    fVar106 = afStack_108[uVar53 * 2];
    fVar132 = afStack_108[uVar53 * 2 + 1];
    local_538._0_4_ =
         fVar106 * (1.0 - (float)uVar52 * 0.33333334) + fVar132 * (float)uVar52 * 0.33333334;
    fStack_530 = fVar106 * (1.0 - fVar157) + fVar132 * fVar157;
    fVar157 = fVar106 * 0.0 + fVar132 * 0.0;
    fVar132 = fVar106 * 0.0 + fVar132 * 0.0;
    fVar106 = fStack_530 - (float)local_538._0_4_;
    if (fVar106 < 0.16666667) {
      fVar299 = 1.0 - (float)local_538._4_4_;
      fVar248 = 1.0 - (float)local_538._4_4_;
      fVar311 = 1.0 - fStack_52c;
      fVar294 = 1.0 - fStack_52c;
      fVar296 = fVar208 * fVar299 + fVar234 * (float)local_538._4_4_;
      fVar309 = fVar209 * fVar248 + fVar247 * (float)local_538._4_4_;
      fVar251 = fVar208 * fVar311 + fVar234 * fStack_52c;
      fVar283 = fVar209 * fVar294 + fVar247 * fStack_52c;
      fVar169 = fVar265 * fVar299 + fVar279 * (float)local_538._4_4_;
      fVar203 = fVar268 * fVar248 + fVar280 * (float)local_538._4_4_;
      fVar249 = fVar265 * fVar311 + fVar279 * fStack_52c;
      fVar233 = fVar268 * fVar294 + fVar280 * fStack_52c;
      fVar172 = fVar281 * fVar299 + fVar204 * (float)local_538._4_4_;
      fVar174 = fVar293 * fVar248 + fVar207 * (float)local_538._4_4_;
      fVar264 = fVar281 * fVar311 + fVar204 * fStack_52c;
      fVar267 = fVar293 * fVar294 + fVar207 * fStack_52c;
      fVar158 = (fVar299 * fVar222 + (float)local_538._4_4_ * fVar104) - fVar172;
      fVar321 = (fVar248 * fVar223 + (float)local_538._4_4_ * fVar67) - fVar174;
      fVar170 = (fVar311 * fVar222 + fStack_52c * fVar104) - fVar264;
      fVar322 = (fVar294 * fVar223 + fStack_52c * fVar67) - fVar267;
      fVar299 = (float)local_538._0_4_ * (fVar172 - fVar169) + fVar169;
      fVar248 = (float)local_538._0_4_ * (fVar174 - fVar203) + fVar203;
      fVar311 = (float)local_538._0_4_ * (fVar264 - fVar249) + fVar249;
      fVar294 = (float)local_538._0_4_ * (fVar267 - fVar233) + fVar233;
      fVar173 = (fVar172 - fVar169) * fStack_530 + fVar169;
      fVar175 = (fVar174 - fVar203) * fStack_530 + fVar203;
      fVar266 = (fVar264 - fVar249) * fStack_530 + fVar249;
      fVar284 = (fVar267 - fVar233) * fStack_530 + fVar233;
      fVar315 = (float)local_538._0_4_ * (fVar169 - fVar296) + fVar296;
      fVar319 = (float)local_538._0_4_ * (fVar203 - fVar309) + fVar309;
      fVar297 = (float)local_538._0_4_ * (fVar249 - fVar251) + fVar251;
      fVar300 = (float)local_538._0_4_ * (fVar233 - fVar283) + fVar283;
      fVar315 = (fVar299 - fVar315) * (float)local_538._0_4_ + fVar315;
      fVar319 = (fVar248 - fVar319) * (float)local_538._0_4_ + fVar319;
      fVar297 = (fVar311 - fVar297) * (float)local_538._0_4_ + fVar297;
      fVar300 = (fVar294 - fVar300) * (float)local_538._0_4_ + fVar300;
      fVar299 = ((((float)local_538._0_4_ * fVar158 + fVar172) - fVar299) * (float)local_538._0_4_ +
                fVar299) - fVar315;
      fVar248 = ((((float)local_538._0_4_ * fVar321 + fVar174) - fVar248) * (float)local_538._0_4_ +
                fVar248) - fVar319;
      fVar311 = ((((float)local_538._0_4_ * fVar170 + fVar264) - fVar311) * (float)local_538._0_4_ +
                fVar311) - fVar297;
      fVar294 = ((((float)local_538._0_4_ * fVar322 + fVar267) - fVar294) * (float)local_538._0_4_ +
                fVar294) - fVar300;
      fVar315 = (float)local_538._0_4_ * fVar299 + fVar315;
      fVar319 = (float)local_538._0_4_ * fVar248 + fVar319;
      fVar297 = (float)local_538._0_4_ * fVar311 + fVar297;
      fVar300 = (float)local_538._0_4_ * fVar294 + fVar300;
      fVar296 = (fVar169 - fVar296) * fStack_530 + fVar296;
      fVar309 = (fVar203 - fVar309) * fStack_530 + fVar309;
      fVar251 = (fVar249 - fVar251) * fStack_530 + fVar251;
      fVar283 = (fVar233 - fVar283) * fStack_530 + fVar283;
      fVar296 = (fVar173 - fVar296) * fStack_530 + fVar296;
      fVar309 = (fVar175 - fVar309) * fStack_530 + fVar309;
      fVar251 = (fVar266 - fVar251) * fStack_530 + fVar251;
      fVar283 = (fVar284 - fVar283) * fStack_530 + fVar283;
      fVar203 = (((fVar158 * fStack_530 + fVar172) - fVar173) * fStack_530 + fVar173) - fVar296;
      fVar249 = (((fVar321 * fStack_530 + fVar174) - fVar175) * fStack_530 + fVar175) - fVar309;
      fVar233 = (((fVar170 * fStack_530 + fVar264) - fVar266) * fStack_530 + fVar266) - fVar251;
      fVar175 = (((fVar322 * fStack_530 + fVar267) - fVar284) * fStack_530 + fVar284) - fVar283;
      fVar296 = fStack_530 * fVar203 + fVar296;
      fVar309 = fStack_530 * fVar249 + fVar309;
      fVar251 = fStack_530 * fVar233 + fVar251;
      fVar283 = fStack_530 * fVar175 + fVar283;
      fVar169 = fVar106 * 0.33333334;
      fVar158 = fVar299 * 3.0 * fVar169 + fVar315;
      fVar321 = fVar248 * 3.0 * fVar169 + fVar319;
      fVar170 = fVar311 * 3.0 * fVar169 + fVar297;
      fVar322 = fVar294 * 3.0 * fVar169 + fVar300;
      fVar172 = fVar296 - fVar169 * fVar203 * 3.0;
      fVar173 = fVar309 - fVar169 * fVar249 * 3.0;
      fVar174 = fVar251 - fVar169 * fVar233 * 3.0;
      fVar175 = fVar283 - fVar169 * fVar175 * 3.0;
      fVar299 = (fVar251 - fVar296) + (fVar297 - fVar315);
      fVar248 = (fVar283 - fVar309) + (fVar300 - fVar319);
      auVar242._0_4_ = fVar173 * fVar248;
      auVar242._4_4_ = fVar173 * fVar248;
      auVar242._8_4_ = fVar175 * fVar248;
      auVar242._12_4_ = fVar175 * fVar248;
      fVar169 = fVar315 * fVar299 + fVar319 * fVar248;
      fVar203 = fVar297 * fVar299 + fVar300 * fVar248;
      fVar311 = fVar158 * fVar299 + fVar321 * fVar248;
      fVar294 = fVar170 * fVar299 + fVar322 * fVar248;
      fVar264 = fVar172 * fVar299 + auVar242._0_4_;
      auVar217._0_8_ = CONCAT44(fVar173 * fVar299 + auVar242._4_4_,fVar264);
      auVar217._8_4_ = fVar174 * fVar299 + auVar242._8_4_;
      auVar217._12_4_ = fVar175 * fVar299 + auVar242._12_4_;
      fVar233 = fVar299 * fVar296 + fVar248 * fVar309;
      fVar266 = fVar299 * fVar251 + fVar248 * fVar283;
      auVar22._4_8_ = auVar242._8_8_;
      auVar22._0_4_ = fVar321 * fVar299 + fVar321 * fVar248;
      auVar243._0_8_ = auVar22._0_8_ << 0x20;
      auVar243._8_4_ = fVar294;
      auVar243._12_4_ = fVar322 * fVar299 + fVar322 * fVar248;
      fVar249 = fVar311;
      if (fVar311 <= fVar169) {
        fVar249 = fVar169;
        fVar169 = fVar311;
      }
      auVar244._8_8_ = auVar243._8_8_;
      auVar244._0_8_ = auVar244._8_8_;
      auVar91._8_4_ = auVar217._8_4_;
      auVar91._0_8_ = auVar217._0_8_;
      auVar91._12_4_ = auVar217._12_4_;
      if (fVar233 <= fVar264) {
        auVar91._0_4_ = fVar233;
      }
      if (auVar91._0_4_ <= fVar169) {
        fVar169 = auVar91._0_4_;
      }
      auVar23._4_8_ = auVar91._8_8_;
      auVar23._0_4_ = fVar299 * fVar309 + fVar248 * fVar309;
      auVar92._0_8_ = auVar23._0_8_ << 0x20;
      auVar92._8_4_ = fVar266;
      auVar92._12_4_ = fVar299 * fVar283 + fVar248 * fVar283;
      if (fVar233 <= fVar264) {
        fVar233 = fVar264;
      }
      auVar93._8_8_ = auVar92._8_8_;
      auVar93._0_8_ = auVar93._8_8_;
      if (fVar233 <= fVar249) {
        fVar233 = fVar249;
      }
      if (fVar294 <= fVar203) {
        auVar244._0_4_ = fVar203;
        fVar203 = fVar294;
      }
      auVar124._8_4_ = auVar217._8_4_;
      auVar124._0_8_ = auVar217._8_8_;
      auVar124._12_4_ = auVar217._12_4_;
      if (fVar266 <= auVar217._8_4_) {
        auVar124._0_4_ = fVar266;
      }
      if (auVar124._0_4_ <= fVar203) {
        fVar203 = auVar124._0_4_;
      }
      if (fVar266 <= auVar217._8_4_) {
        auVar93._0_4_ = auVar217._8_4_;
      }
      if (auVar93._0_4_ <= auVar244._0_4_) {
        auVar93._0_4_ = auVar244._0_4_;
      }
      fVar249 = auVar93._0_4_;
      if ((0.0001 <= fVar169) || (fVar249 <= -0.0001)) break;
      goto LAB_00b580e3;
    }
  } while( true );
  if ((fVar203 < 0.0001 && -0.0001 < fVar233) ||
     ((fVar169 < 0.0001 && -0.0001 < fVar233 || (fVar203 < 0.0001 && -0.0001 < fVar249)))) {
LAB_00b580e3:
    fVar248 = (float)(~-(uint)(fVar169 < 0.0) & 0x3f800000 | -(uint)(fVar169 < 0.0) & 0xbf800000);
    fVar311 = (float)(~-(uint)(fVar233 < 0.0) & 0x3f800000 | -(uint)(fVar233 < 0.0) & 0xbf800000);
    fVar299 = 0.0;
    if ((fVar248 == fVar311) && (!NAN(fVar248) && !NAN(fVar311))) {
      fVar299 = INFINITY;
    }
    fVar294 = 0.0;
    if ((fVar248 == fVar311) && (!NAN(fVar248) && !NAN(fVar311))) {
      fVar294 = -INFINITY;
    }
    fVar264 = (float)(~-(uint)(fVar203 < 0.0) & 0x3f800000 | -(uint)(fVar203 < 0.0) & 0xbf800000);
    if ((fVar248 != fVar264) || (fVar266 = fVar294, NAN(fVar248) || NAN(fVar264))) {
      if ((fVar203 != fVar169) || (NAN(fVar203) || NAN(fVar169))) {
        fVar203 = -fVar169 / (fVar203 - fVar169);
        fVar203 = (1.0 - fVar203) * 0.0 + fVar203;
        fVar266 = fVar203;
      }
      else {
        fVar203 = 0.0;
        if ((fVar169 != 0.0) || (fVar266 = 1.0, NAN(fVar169))) {
          fVar203 = INFINITY;
          fVar266 = -INFINITY;
        }
      }
      if (fVar203 <= fVar299) {
        fVar299 = fVar203;
      }
      if (fVar266 <= fVar294) {
        fVar266 = fVar294;
      }
    }
    fVar169 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar249 < 0.0) * 4);
    if ((fVar311 != fVar169) || (fVar203 = fVar266, NAN(fVar311) || NAN(fVar169))) {
      if ((fVar249 != fVar233) || (NAN(fVar249) || NAN(fVar233))) {
        fVar248 = -fVar233 / (fVar249 - fVar233);
        fVar248 = (1.0 - fVar248) * 0.0 + fVar248;
        fVar203 = fVar248;
      }
      else {
        fVar248 = 0.0;
        if ((fVar233 != 0.0) || (fVar203 = 1.0, NAN(fVar233))) {
          fVar248 = INFINITY;
          fVar203 = -INFINITY;
        }
      }
      if (fVar248 <= fVar299) {
        fVar299 = fVar248;
      }
      if (fVar203 <= fVar266) {
        fVar203 = fVar266;
      }
    }
    if ((fVar264 != fVar169) || (NAN(fVar264) || NAN(fVar169))) {
      fVar299 = (float)(~-(uint)(fVar299 < 1.0) & 0x3f800000 |
                       (uint)fVar299 & -(uint)(fVar299 < 1.0));
      fVar203 = (float)(~-(uint)(fVar203 < 1.0) & (uint)fVar203 |
                       -(uint)(fVar203 < 1.0) & 0x3f800000);
    }
    fVar299 = (float)(~-(uint)(fVar299 < 0.0) & (uint)fVar299);
    fVar169 = (float)(~-(uint)(fVar203 < 1.0) & 0x3f800000 | (uint)fVar203 & -(uint)(fVar203 < 1.0))
    ;
    if (fVar299 <= fVar169) {
      fVar299 = fVar299 + -0.1;
      fVar169 = fVar169 + 0.1;
      uVar65 = -(uint)(fVar169 < 1.0);
      fVar299 = (float)(~-(uint)(fVar299 < 0.0) & (uint)fVar299);
      fVar169 = (float)(~uVar65 & 0x3f800000 | (uint)fVar169 & uVar65);
      fVar264 = 1.0 - fVar299;
      fVar266 = 1.0 - fVar299;
      fVar267 = 1.0 - fVar169;
      fVar284 = 1.0 - fVar169;
      fVar203 = fVar315 * fVar264 + fVar297 * fVar299;
      fVar233 = fVar319 * fVar266 + fVar300 * fVar299;
      fVar248 = fVar315 * fVar267 + fVar297 * fVar169;
      fVar311 = fVar319 * fVar284 + fVar300 * fVar169;
      fVar294 = fVar158 * fVar264 + fVar170 * fVar299;
      fVar315 = fVar321 * fVar266 + fVar322 * fVar299;
      fVar297 = fVar158 * fVar267 + fVar170 * fVar169;
      fVar300 = fVar321 * fVar284 + fVar322 * fVar169;
      fVar158 = fVar172 * fVar264 + fVar174 * fVar299;
      fVar321 = fVar173 * fVar266 + fVar175 * fVar299;
      fVar170 = fVar172 * fVar267 + fVar174 * fVar169;
      fVar322 = fVar173 * fVar284 + fVar175 * fVar169;
      fVar172 = fVar264 * fVar296 + fVar251 * fVar299;
      fVar173 = fVar266 * fVar309 + fVar283 * fVar299;
      fVar296 = fVar267 * fVar296 + fVar251 * fVar169;
      fVar309 = fVar284 * fVar309 + fVar283 * fVar169;
      fVar251 = (float)local_538._4_4_ * (1.0 - fVar169);
      local_538._4_4_ = (float)local_538._4_4_ * (1.0 - fVar299) + fStack_52c * fVar299;
      fStack_52c = fVar251 + fStack_52c * fVar169;
      fVar319 = 1.0 / fVar106;
      auVar125._0_4_ = fVar296 - fVar172;
      auVar125._4_4_ = fVar309 - fVar173;
      auVar125._8_4_ = fVar296 - fVar296;
      auVar125._12_4_ = fVar309 - fVar309;
      auVar153._0_8_ = CONCAT44(fVar322 - fVar321,fVar170 - fVar158);
      auVar153._8_4_ = fVar170 - fVar170;
      auVar153._12_4_ = fVar322 - fVar322;
      auVar197._0_4_ = fVar297 - fVar294;
      auVar197._4_4_ = fVar300 - fVar315;
      auVar197._8_4_ = fVar297 - fVar297;
      auVar197._12_4_ = fVar300 - fVar300;
      auVar245._0_8_ = CONCAT44((fVar315 - fVar233) * 3.0,(fVar294 - fVar203) * 3.0);
      auVar245._8_4_ = (fVar297 - fVar248) * 3.0;
      auVar245._12_4_ = (fVar300 - fVar311) * 3.0;
      auVar165._0_8_ = CONCAT44((fVar321 - fVar315) * 3.0,(fVar158 - fVar294) * 3.0);
      auVar165._8_4_ = (fVar170 - fVar297) * 3.0;
      auVar165._12_4_ = (fVar322 - fVar300) * 3.0;
      auVar275._0_4_ = (fVar172 - fVar158) * 3.0;
      auVar275._4_4_ = (fVar173 - fVar321) * 3.0;
      auVar275._8_4_ = (fVar296 - fVar170) * 3.0;
      auVar275._12_4_ = (fVar309 - fVar322) * 3.0;
      auVar218._8_4_ = auVar165._8_4_;
      auVar218._0_8_ = auVar165._0_8_;
      auVar218._12_4_ = auVar165._12_4_;
      auVar136 = minps(auVar218,auVar275);
      auVar68 = maxps(auVar165,auVar275);
      auVar259._8_4_ = auVar245._8_4_;
      auVar259._0_8_ = auVar245._0_8_;
      auVar259._12_4_ = auVar245._12_4_;
      auVar138 = minps(auVar259,auVar136);
      auVar239 = maxps(auVar245,auVar68);
      auVar24._4_8_ = auVar68._8_8_;
      auVar24._0_4_ = auVar138._4_4_;
      auVar166._0_8_ = auVar24._0_8_ << 0x20;
      auVar166._8_4_ = auVar138._8_4_;
      auVar166._12_4_ = auVar138._12_4_;
      auVar167._8_8_ = auVar138._8_8_;
      auVar167._0_8_ = auVar166._8_8_;
      auVar25._4_8_ = auVar136._8_8_;
      auVar25._0_4_ = auVar239._4_4_;
      auVar219._0_8_ = auVar25._0_8_ << 0x20;
      auVar219._8_4_ = auVar239._8_4_;
      auVar219._12_4_ = auVar239._12_4_;
      auVar220._8_8_ = auVar239._8_8_;
      auVar220._0_8_ = auVar219._8_8_;
      auVar136 = minps(auVar138,auVar167);
      auVar68 = maxps(auVar239,auVar220);
      fVar266 = auVar136._0_4_ * fVar319;
      fVar267 = auVar136._4_4_ * fVar319;
      fVar284 = auVar136._8_4_ * fVar319;
      fVar295 = auVar136._12_4_ * fVar319;
      fVar297 = fVar319 * auVar68._0_4_;
      fVar158 = fVar319 * auVar68._4_4_;
      fVar170 = fVar319 * auVar68._8_4_;
      fVar319 = fVar319 * auVar68._12_4_;
      fVar175 = 1.0 / (fStack_52c - (float)local_538._4_4_);
      auVar94._0_8_ = CONCAT44(fVar311 - fVar233,fVar248 - fVar203);
      auVar94._8_4_ = fVar248 - fVar248;
      auVar94._12_4_ = fVar311 - fVar311;
      auVar227._8_4_ = auVar94._8_4_;
      auVar227._0_8_ = auVar94._0_8_;
      auVar227._12_4_ = auVar94._12_4_;
      auVar239 = minps(auVar227,auVar197);
      auVar68 = maxps(auVar94,auVar197);
      auVar144._8_4_ = auVar153._8_4_;
      auVar144._0_8_ = auVar153._0_8_;
      auVar144._12_4_ = auVar153._12_4_;
      auVar136 = minps(auVar144,auVar125);
      auVar239 = minps(auVar239,auVar136);
      auVar136 = maxps(auVar153,auVar125);
      auVar68 = maxps(auVar68,auVar136);
      fVar173 = auVar239._0_4_ * fVar175;
      fVar174 = auVar239._4_4_ * fVar175;
      fVar264 = fVar175 * auVar68._0_4_;
      fVar175 = fVar175 * auVar68._4_4_;
      auVar221._4_4_ = fStack_52c;
      auVar221._0_4_ = fStack_530;
      auVar221._8_4_ = fVar157;
      auVar221._12_4_ = fVar132;
      fVar283 = ((float)local_538._0_4_ + fStack_530) * 0.5;
      fVar311 = ((float)local_538._4_4_ + fStack_52c) * 0.5;
      fVar294 = (fStack_530 + fVar157) * 0.0;
      fVar315 = (fStack_52c + fVar132) * 0.0;
      fVar169 = local_118 * fVar283 + fVar208;
      fVar203 = fStack_114 * fVar283 + fVar209;
      fVar233 = fStack_110 * fVar283 + fStack_3b0;
      fVar296 = fStack_10c * fVar283 + fStack_3ac;
      fVar299 = local_128 * fVar283 + fVar265;
      fVar309 = fStack_124 * fVar283 + fVar268;
      fVar248 = fStack_120 * fVar283 + fVar279;
      fVar251 = fStack_11c * fVar283 + fVar280;
      fVar169 = (fVar299 - fVar169) * fVar283 + fVar169;
      fVar203 = (fVar309 - fVar203) * fVar283 + fVar203;
      fVar233 = (fVar248 - fVar233) * fVar283 + fVar233;
      fVar296 = (fVar251 - fVar296) * fVar283 + fVar296;
      fVar299 = (((local_138 * fVar283 + (float)local_348) - fVar299) * fVar283 + fVar299) - fVar169
      ;
      fVar309 = (((fStack_134 * fVar283 + local_348._4_4_) - fVar309) * fVar283 + fVar309) - fVar203
      ;
      fVar248 = (((fStack_130 * fVar283 + fStack_340) - fVar248) * fVar283 + fVar248) - fVar233;
      fVar251 = (((fStack_12c * fVar283 + fStack_33c) - fVar251) * fVar283 + fVar251) - fVar296;
      fVar169 = fVar283 * fVar299 + fVar169;
      fVar203 = fVar283 * fVar309 + fVar203;
      fVar299 = fVar299 * 3.0;
      fVar309 = fVar309 * 3.0;
      fVar233 = (fVar283 * fVar248 + fVar233) - fVar169;
      fVar296 = (fVar283 * fVar251 + fVar296) - fVar203;
      fVar299 = (fVar248 * 3.0 - fVar299) * fVar311 + fVar299;
      fVar309 = (fVar251 * 3.0 - fVar309) * fVar311 + fVar309;
      auVar154._0_8_ = CONCAT44(fVar299,fVar233) ^ 0x80000000;
      auVar154._8_4_ = fVar299;
      auVar154._12_4_ = fVar299;
      fVar298 = (float)local_538._0_4_ - fVar283;
      fVar301 = (float)local_538._4_4_ - fVar311;
      fVar304 = fStack_530 - fVar294;
      fVar306 = fStack_52c - fVar315;
      fVar310 = fStack_530 - fVar283;
      fVar312 = fStack_52c - fVar311;
      fVar157 = fVar157 - fVar294;
      fVar132 = fVar132 - fVar315;
      fVar169 = fVar233 * fVar311 + fVar169;
      fVar203 = fVar296 * fVar311 + fVar203;
      auVar168._0_8_ = CONCAT44(fVar309,fVar296) ^ 0x8000000000000000;
      auVar168._8_4_ = -fVar309;
      auVar168._12_4_ = -fVar309;
      auVar95._0_4_ = fVar296 * fVar299 - fVar309 * fVar233;
      auVar95._4_4_ = auVar95._0_4_;
      auVar95._8_4_ = auVar95._0_4_;
      auVar95._12_4_ = auVar95._0_4_;
      auVar136 = divps(auVar168,auVar95);
      auVar68 = divps(auVar154,auVar95);
      fVar294 = auVar136._0_4_;
      fVar315 = auVar136._4_4_;
      fVar248 = auVar68._0_4_;
      fVar251 = auVar68._4_4_;
      fVar283 = fVar283 - (fVar203 * fVar248 + fVar169 * fVar294);
      fVar299 = fVar311 - (fVar203 * fVar251 + fVar169 * fVar315);
      fVar309 = fVar311 - (fVar203 * auVar68._8_4_ + fVar169 * auVar136._8_4_);
      fVar311 = fVar311 - (fVar203 * auVar68._12_4_ + fVar169 * auVar136._12_4_);
      auVar126._0_8_ = CONCAT44(fVar315 * fVar173,fVar315 * fVar266);
      auVar126._8_4_ = fVar315 * fVar267;
      auVar126._12_4_ = fVar315 * fVar174;
      auVar96._0_4_ = fVar315 * fVar297;
      auVar96._4_4_ = fVar315 * fVar264;
      auVar96._8_4_ = fVar315 * fVar158;
      auVar96._12_4_ = fVar315 * fVar175;
      auVar327._8_4_ = auVar126._8_4_;
      auVar327._0_8_ = auVar126._0_8_;
      auVar327._12_4_ = auVar126._12_4_;
      auVar138 = minps(auVar327,auVar96);
      auVar68 = maxps(auVar96,auVar126);
      auVar198._0_8_ = CONCAT44(fVar251 * fVar174,fVar251 * fVar267);
      auVar198._8_4_ = fVar251 * fVar284;
      auVar198._12_4_ = fVar251 * fVar295;
      auVar127._0_4_ = fVar251 * fVar158;
      auVar127._4_4_ = fVar251 * fVar175;
      auVar127._8_4_ = fVar251 * fVar170;
      auVar127._12_4_ = fVar251 * fVar319;
      auVar260._8_4_ = auVar198._8_4_;
      auVar260._0_8_ = auVar198._0_8_;
      auVar260._12_4_ = auVar198._12_4_;
      auVar239 = minps(auVar260,auVar127);
      auVar136 = maxps(auVar127,auVar198);
      fVar169 = 0.0 - (auVar136._0_4_ + auVar68._0_4_);
      fVar203 = 1.0 - (auVar136._4_4_ + auVar68._4_4_);
      fVar233 = 0.0 - (auVar136._8_4_ + auVar68._8_4_);
      fVar296 = 0.0 - (auVar136._12_4_ + auVar68._12_4_);
      fVar300 = 0.0 - (auVar239._0_4_ + auVar138._0_4_);
      fVar321 = 1.0 - (auVar239._4_4_ + auVar138._4_4_);
      fVar322 = 0.0 - (auVar239._8_4_ + auVar138._8_4_);
      fVar172 = 0.0 - (auVar239._12_4_ + auVar138._12_4_);
      auVar128._0_8_ = CONCAT44(fVar301 * fVar203,fVar298 * fVar169);
      auVar128._8_4_ = fVar304 * fVar233;
      auVar128._12_4_ = fVar306 * fVar296;
      auVar276._0_8_ = CONCAT44(fVar173 * fVar294,fVar266 * fVar294);
      auVar276._8_4_ = fVar267 * fVar294;
      auVar276._12_4_ = fVar174 * fVar294;
      auVar199._0_4_ = fVar294 * fVar297;
      auVar199._4_4_ = fVar294 * fVar264;
      auVar199._8_4_ = fVar294 * fVar158;
      auVar199._12_4_ = fVar294 * fVar175;
      auVar261._8_4_ = auVar276._8_4_;
      auVar261._0_8_ = auVar276._0_8_;
      auVar261._12_4_ = auVar276._12_4_;
      auVar136 = minps(auVar261,auVar199);
      auVar68 = maxps(auVar199,auVar276);
      auVar228._0_8_ = CONCAT44(fVar174 * fVar248,fVar267 * fVar248);
      auVar228._8_4_ = fVar284 * fVar248;
      auVar228._12_4_ = fVar295 * fVar248;
      auVar277._0_4_ = fVar248 * fVar158;
      auVar277._4_4_ = fVar248 * fVar175;
      auVar277._8_4_ = fVar248 * fVar170;
      auVar277._12_4_ = fVar248 * fVar319;
      auVar326._8_4_ = auVar228._8_4_;
      auVar326._0_8_ = auVar228._0_8_;
      auVar326._12_4_ = auVar228._12_4_;
      auVar138 = minps(auVar326,auVar277);
      auVar262._0_4_ = fVar298 * fVar300;
      auVar262._4_4_ = fVar301 * fVar321;
      auVar262._8_4_ = fVar304 * fVar322;
      auVar262._12_4_ = fVar306 * fVar172;
      auVar97._0_8_ = CONCAT44(fVar203 * fVar312,fVar169 * fVar310);
      auVar97._8_4_ = fVar233 * fVar157;
      auVar97._12_4_ = fVar296 * fVar132;
      auVar206._0_4_ = fVar300 * fVar310;
      auVar206._4_4_ = fVar321 * fVar312;
      auVar206._8_4_ = fVar322 * fVar157;
      auVar206._12_4_ = fVar172 * fVar132;
      auVar239 = maxps(auVar277,auVar228);
      fVar169 = 1.0 - (auVar239._0_4_ + auVar68._0_4_);
      fVar203 = 0.0 - (auVar239._4_4_ + auVar68._4_4_);
      fVar233 = 0.0 - (auVar239._8_4_ + auVar68._8_4_);
      fVar296 = 0.0 - (auVar239._12_4_ + auVar68._12_4_);
      fVar319 = 1.0 - (auVar138._0_4_ + auVar136._0_4_);
      fVar297 = 0.0 - (auVar138._4_4_ + auVar136._4_4_);
      fVar300 = 0.0 - (auVar138._8_4_ + auVar136._8_4_);
      fVar158 = 0.0 - (auVar138._12_4_ + auVar136._12_4_);
      auVar229._0_8_ = CONCAT44(fVar301 * fVar203,fVar298 * fVar169);
      auVar229._8_4_ = fVar304 * fVar233;
      auVar229._12_4_ = fVar306 * fVar296;
      auVar292._0_4_ = fVar298 * fVar319;
      auVar292._4_4_ = fVar301 * fVar297;
      auVar292._8_4_ = fVar304 * fVar300;
      auVar292._12_4_ = fVar306 * fVar158;
      auVar200._0_8_ = CONCAT44(fVar203 * fVar312,fVar169 * fVar310);
      auVar200._8_4_ = fVar233 * fVar157;
      auVar200._12_4_ = fVar296 * fVar132;
      auVar246._0_4_ = fVar319 * fVar310;
      auVar246._4_4_ = fVar297 * fVar312;
      auVar246._8_4_ = fVar300 * fVar157;
      auVar246._12_4_ = fVar158 * fVar132;
      auVar278._8_4_ = auVar229._8_4_;
      auVar278._0_8_ = auVar229._0_8_;
      auVar278._12_4_ = auVar229._12_4_;
      auVar68 = minps(auVar278,auVar292);
      auVar308._8_4_ = auVar200._8_4_;
      auVar308._0_8_ = auVar200._0_8_;
      auVar308._12_4_ = auVar200._12_4_;
      auVar136 = minps(auVar308,auVar246);
      auVar241 = minps(auVar68,auVar136);
      auVar136 = maxps(auVar292,auVar229);
      auVar68 = maxps(auVar246,auVar200);
      auVar239 = maxps(auVar68,auVar136);
      auVar230._8_4_ = auVar128._8_4_;
      auVar230._0_8_ = auVar128._0_8_;
      auVar230._12_4_ = auVar128._12_4_;
      auVar136 = minps(auVar230,auVar262);
      auVar201._8_4_ = auVar97._8_4_;
      auVar201._0_8_ = auVar97._0_8_;
      auVar201._12_4_ = auVar97._12_4_;
      auVar68 = minps(auVar201,auVar206);
      auVar136 = minps(auVar136,auVar68);
      auVar138 = maxps(auVar262,auVar128);
      auVar68 = maxps(auVar206,auVar97);
      auVar68 = maxps(auVar68,auVar138);
      auVar231._0_4_ = auVar241._4_4_ + auVar241._0_4_ + fVar283;
      auVar231._4_4_ = auVar136._4_4_ + auVar136._0_4_ + fVar299;
      auVar231._8_4_ = auVar241._8_4_ + auVar241._4_4_ + fVar309;
      auVar231._12_4_ = auVar241._12_4_ + auVar136._4_4_ + fVar311;
      fVar132 = auVar239._4_4_ + auVar239._0_4_ + fVar283;
      fVar157 = auVar68._4_4_ + auVar68._0_4_ + fVar299;
      auVar98._4_4_ = fVar157;
      auVar98._0_4_ = fVar132;
      auVar136 = maxps(_local_538,auVar231);
      auVar98._8_4_ = auVar239._8_4_ + auVar239._4_4_ + fVar309;
      auVar98._12_4_ = auVar239._12_4_ + auVar68._4_4_ + fVar311;
      auVar68 = minps(auVar98,auVar221);
      iVar50 = -(uint)(auVar68._0_4_ < auVar136._0_4_);
      iVar63 = -(uint)(auVar68._4_4_ < auVar136._4_4_);
      auVar100._4_4_ = iVar63;
      auVar100._0_4_ = iVar50;
      auVar100._8_4_ = iVar63;
      auVar100._12_4_ = iVar63;
      auVar99._8_8_ = auVar100._8_8_;
      auVar99._4_4_ = iVar50;
      auVar99._0_4_ = iVar50;
      iVar50 = movmskpd((uint)(fVar249 < 0.0),auVar99);
      if (iVar50 == 0) {
        bVar49 = 0;
        if (((float)local_538._0_4_ < auVar231._0_4_) && (fVar132 < fStack_530)) {
          bVar49 = -(fVar157 < fStack_52c) & (float)local_538._4_4_ < auVar231._4_4_;
        }
        bVar49 = (3 < uVar64 || fVar106 < 0.001) | bVar49;
        uVar53 = (ulong)CONCAT31((int3)(uVar62 >> 8),bVar49);
        if (bVar49 != 1) goto LAB_00b576f7;
        lVar54 = 200;
        do {
          fVar106 = 1.0 - fVar283;
          fVar203 = fVar283 * fVar283 * fVar283;
          fVar169 = fVar283 * fVar283 * 3.0 * fVar106;
          fVar132 = fVar106 * fVar106 * fVar106;
          fVar249 = fVar283 * 3.0 * fVar106 * fVar106;
          fVar157 = fVar132 * fVar208 +
                    fVar249 * fVar265 + fVar169 * (float)local_348 + fVar203 * fVar222;
          fVar106 = fVar132 * fVar209 +
                    fVar249 * fVar268 + fVar169 * local_348._4_4_ + fVar203 * fVar223;
          fVar157 = ((fVar132 * fStack_3b0 +
                     fVar249 * fVar279 + fVar169 * fStack_340 + fVar203 * fVar104) - fVar157) *
                    fVar299 + fVar157;
          fVar106 = ((fVar132 * fStack_3ac +
                     fVar249 * fVar280 + fVar169 * fStack_33c + fVar203 * fVar67) - fVar106) *
                    fVar299 + fVar106;
          fVar283 = fVar283 - (fVar106 * fVar248 + fVar157 * fVar294);
          fVar299 = fVar299 - (fVar106 * fVar251 + fVar157 * fVar315);
          fVar157 = (float)((uint)fVar157 & (uint)DAT_01f7b6c0);
          fVar106 = (float)((uint)fVar106 & DAT_01f7b6c0._4_4_);
          if (fVar106 <= fVar157) {
            fVar106 = fVar157;
          }
          if (fVar106 < fVar146) {
            if ((((0.0 <= fVar283) && (fVar283 <= 1.0)) && (0.0 <= fVar299)) && (fVar299 <= 1.0)) {
              fVar106 = pre->ray_space[k].vx.field_0.m128[2];
              fVar132 = pre->ray_space[k].vy.field_0.m128[2];
              fVar157 = pre->ray_space[k].vz.field_0.m128[2];
              fVar309 = 1.0 - fVar299;
              fVar296 = 1.0 - fVar283;
              fVar169 = fVar296 * fVar296 * fVar296;
              fVar203 = fVar283 * 3.0 * fVar296 * fVar296;
              fVar233 = fVar283 * fVar283 * fVar283;
              fVar249 = fVar283 * fVar283 * 3.0 * fVar296;
              fVar106 = ((fStack_140 * fVar157 + fStack_144 * fVar132 + local_148 * fVar106) *
                         fVar309 +
                        (fStack_180 * fVar157 + fStack_184 * fVar132 + local_188 * fVar106) *
                        fVar299) * fVar169 +
                        ((fStack_150 * fVar157 + fStack_154 * fVar132 + local_158 * fVar106) *
                         fVar309 +
                        (fStack_190 * fVar157 + fStack_194 * fVar132 + local_198 * fVar106) *
                        fVar299) * fVar203 +
                        ((fStack_160 * fVar157 + fStack_164 * fVar132 + local_168 * fVar106) *
                         fVar309 +
                        (fStack_1a0 * fVar157 + fStack_1a4 * fVar132 + local_1a8 * fVar106) *
                        fVar299) * fVar249 +
                        (fVar309 * (fStack_170 * fVar157 +
                                   fStack_174 * fVar132 + local_178 * fVar106) +
                        (fVar157 * fStack_1b0 + fVar132 * fStack_1b4 + fVar106 * local_1b8) *
                        fVar299) * fVar233;
              if ((fVar105 <= fVar106) &&
                 (fVar132 = *(float *)(ray + k * 4 + 0x80), fVar106 <= fVar132)) {
                fVar251 = 1.0 - fVar299;
                fVar311 = 1.0 - fVar299;
                fVar294 = 1.0 - fVar299;
                fVar157 = fVar317 * fVar251 + fVar252 * fVar299;
                fVar309 = fVar250 * fVar311 + fVar263 * fVar299;
                fVar248 = fVar305 * fVar294 + fVar282 * fVar299;
                fVar315 = fVar302 * fVar251 + fVar134 * fVar299;
                fVar297 = fVar224 * fVar311 + fVar147 * fVar299;
                fVar158 = fVar232 * fVar294 + fVar156 * fVar299;
                fVar319 = fVar315 - fVar157;
                fVar300 = fVar297 - fVar309;
                fVar321 = fVar158 - fVar248;
                fVar157 = (((fVar157 - (fVar303 * fVar251 + fVar133 * fVar299)) * fVar296 +
                           fVar283 * fVar319) * fVar296 +
                          (fVar319 * fVar296 +
                          ((fVar251 * fVar171 + local_288 * fVar299) - fVar315) * fVar283) * fVar283
                          ) * 3.0;
                fVar309 = (((fVar309 - (fVar313 * fVar311 + fVar145 * fVar299)) * fVar296 +
                           fVar283 * fVar300) * fVar296 +
                          (fVar300 * fVar296 +
                          ((fVar311 * fVar176 + fStack_284 * fVar299) - fVar297) * fVar283) *
                          fVar283) * 3.0;
                fVar296 = (((fVar248 - (fVar253 * fVar294 + fVar155 * fVar299)) * fVar296 +
                           fVar283 * fVar321) * fVar296 +
                          (fVar321 * fVar296 +
                          ((fVar294 * fVar202 + fStack_280 * fVar299) - fVar158) * fVar283) *
                          fVar283) * 3.0;
                pGVar15 = (context->scene->geometries).items[local_380].ptr;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar60 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar60 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar248 = fVar169 * local_2a8 +
                            fVar203 * local_2b8 + fVar249 * local_2c8 + fVar233 * local_2d8;
                  fVar251 = fVar169 * fStack_2a4 +
                            fVar203 * fStack_2b4 + fVar249 * fStack_2c4 + fVar233 * fStack_2d4;
                  fVar169 = fVar169 * fStack_2a0 +
                            fVar203 * fStack_2b0 + fVar249 * fStack_2c0 + fVar233 * fStack_2d0;
                  local_c8 = fVar251 * fVar157 - fVar309 * fVar248;
                  local_e8 = fVar169 * fVar309 - fVar296 * fVar251;
                  local_d8 = fVar248 * fVar296 - fVar157 * fVar169;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  fStack_c4 = local_c8;
                  fStack_c0 = local_c8;
                  fStack_bc = local_c8;
                  local_b8 = fVar283;
                  fStack_b4 = fVar283;
                  fStack_b0 = fVar283;
                  fStack_ac = fVar283;
                  local_a8 = fVar299;
                  fStack_a4 = fVar299;
                  fStack_a0 = fVar299;
                  fStack_9c = fVar299;
                  local_98 = CONCAT44(uStack_2f4,local_2f8);
                  uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                  local_88 = CONCAT44(uStack_2e4,local_2e8);
                  uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                  local_78 = context->user->instID[0];
                  uStack_74 = local_78;
                  uStack_70 = local_78;
                  uStack_6c = local_78;
                  local_68 = context->user->instPrimID[0];
                  uStack_64 = local_68;
                  uStack_60 = local_68;
                  uStack_5c = local_68;
                  *(float *)(ray + k * 4 + 0x80) = fVar106;
                  local_3a8._0_16_ = *local_390;
                  local_328.valid = (int *)local_3a8;
                  local_328.geometryUserPtr = pGVar15->userPtr;
                  local_328.context = context->user;
                  local_328.ray = (RTCRayN *)ray;
                  local_328.hit = (RTCHitN *)&local_e8;
                  local_328.N = 4;
                  p_Var55 = pGVar15->occlusionFilterN;
                  if (p_Var55 != (RTCFilterFunctionN)0x0) {
                    p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_328);
                  }
                  auVar129._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                  auVar129._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar129._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                  auVar129._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                  uVar62 = movmskps((int)p_Var55,auVar129);
                  pRVar56 = (RTCRayN *)(ulong)(uVar62 ^ 0xf);
                  if ((uVar62 ^ 0xf) == 0) {
                    auVar129 = auVar129 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var55 = context->args->filter;
                    if ((p_Var55 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var55)(&local_328);
                    }
                    auVar101._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                    auVar101._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar101._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                    auVar101._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                    auVar129 = auVar101 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_328.ray + 0x80) =
                         ~auVar101 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar101;
                    pRVar56 = local_328.ray;
                  }
                  auVar130._0_4_ = auVar129._0_4_ << 0x1f;
                  auVar130._4_4_ = auVar129._4_4_ << 0x1f;
                  auVar130._8_4_ = auVar129._8_4_ << 0x1f;
                  auVar130._12_4_ = auVar129._12_4_ << 0x1f;
                  iVar50 = movmskps((int)pRVar56,auVar130);
                  bVar60 = iVar50 != 0;
                  if (!bVar60) {
                    *(float *)(ray + k * 4 + 0x80) = fVar132;
                  }
                }
                bVar57 = (bool)(bVar57 | bVar60);
              }
            }
            break;
          }
          lVar54 = lVar54 + -1;
        } while (lVar54 != 0);
      }
    }
  }
  goto LAB_00b57d7f;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }